

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  ulong uVar65;
  RayK<8> *pRVar66;
  byte bVar67;
  bool bVar68;
  ulong uVar69;
  uint uVar70;
  Geometry *geometry;
  long lVar71;
  ulong uVar72;
  float fVar73;
  float fVar124;
  float fVar126;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar84 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar74;
  undefined1 auVar85 [16];
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar128;
  float fVar131;
  float fVar132;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined4 uVar133;
  vint4 bi_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined8 uVar141;
  vint4 bi_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  float fVar150;
  float fVar161;
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  float fVar162;
  float fVar171;
  float fVar172;
  vint4 bi;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar173;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  vint4 ai;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [64];
  vint4 ai_1;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  uint uVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7b9;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined8 uStack_6d8;
  ulong local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  LinearSpace3fa *local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  int local_49c;
  undefined1 local_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  byte local_450;
  float local_440 [4];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar65 = (ulong)(byte)PVar8;
  fVar162 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar82 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  auVar151._0_4_ = fVar162 * auVar82._0_4_;
  auVar151._4_4_ = fVar162 * auVar82._4_4_;
  auVar151._8_4_ = fVar162 * auVar82._8_4_;
  auVar151._12_4_ = fVar162 * auVar82._12_4_;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar85._0_4_ = fVar162 * auVar80._0_4_;
  auVar85._4_4_ = fVar162 * auVar80._4_4_;
  auVar85._8_4_ = fVar162 * auVar80._8_4_;
  auVar85._12_4_ = fVar162 * auVar80._12_4_;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xb + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar65 + 6)));
  uVar72 = (ulong)(uint)((int)(uVar65 * 9) * 2);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar65 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar69 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar194._4_4_ = auVar85._0_4_;
  auVar194._0_4_ = auVar85._0_4_;
  auVar194._8_4_ = auVar85._0_4_;
  auVar194._12_4_ = auVar85._0_4_;
  auVar22 = vshufps_avx(auVar85,auVar85,0x55);
  auVar84 = vshufps_avx(auVar85,auVar85,0xaa);
  fVar162 = auVar84._0_4_;
  auVar163._0_4_ = fVar162 * auVar75._0_4_;
  fVar171 = auVar84._4_4_;
  auVar163._4_4_ = fVar171 * auVar75._4_4_;
  fVar172 = auVar84._8_4_;
  auVar163._8_4_ = fVar172 * auVar75._8_4_;
  fVar173 = auVar84._12_4_;
  auVar163._12_4_ = fVar173 * auVar75._12_4_;
  auVar142._0_4_ = auVar76._0_4_ * fVar162;
  auVar142._4_4_ = auVar76._4_4_ * fVar171;
  auVar142._8_4_ = auVar76._8_4_ * fVar172;
  auVar142._12_4_ = auVar76._12_4_ * fVar173;
  auVar134._0_4_ = auVar77._0_4_ * fVar162;
  auVar134._4_4_ = auVar77._4_4_ * fVar171;
  auVar134._8_4_ = auVar77._8_4_ * fVar172;
  auVar134._12_4_ = auVar77._12_4_ * fVar173;
  auVar84 = vfmadd231ps_fma(auVar163,auVar22,auVar80);
  auVar79 = vfmadd231ps_fma(auVar142,auVar22,auVar20);
  auVar22 = vfmadd231ps_fma(auVar134,auVar21,auVar22);
  auVar78 = vfmadd231ps_fma(auVar84,auVar194,auVar82);
  auVar79 = vfmadd231ps_fma(auVar79,auVar194,auVar81);
  auVar85 = vfmadd231ps_fma(auVar22,auVar83,auVar194);
  auVar195._4_4_ = auVar151._0_4_;
  auVar195._0_4_ = auVar151._0_4_;
  auVar195._8_4_ = auVar151._0_4_;
  auVar195._12_4_ = auVar151._0_4_;
  auVar22 = vshufps_avx(auVar151,auVar151,0x55);
  auVar84 = vshufps_avx(auVar151,auVar151,0xaa);
  auVar75 = vmulps_avx512vl(auVar84,auVar75);
  auVar152._0_4_ = auVar84._0_4_ * auVar76._0_4_;
  auVar152._4_4_ = auVar84._4_4_ * auVar76._4_4_;
  auVar152._8_4_ = auVar84._8_4_ * auVar76._8_4_;
  auVar152._12_4_ = auVar84._12_4_ * auVar76._12_4_;
  auVar146._0_4_ = auVar84._0_4_ * auVar77._0_4_;
  auVar146._4_4_ = auVar84._4_4_ * auVar77._4_4_;
  auVar146._8_4_ = auVar84._8_4_ * auVar77._8_4_;
  auVar146._12_4_ = auVar84._12_4_ * auVar77._12_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar22,auVar80);
  auVar80 = vfmadd231ps_fma(auVar152,auVar22,auVar20);
  auVar75 = vfmadd231ps_fma(auVar146,auVar22,auVar21);
  auVar77 = vfmadd231ps_avx512vl(auVar76,auVar195,auVar82);
  auVar76 = vfmadd231ps_fma(auVar80,auVar195,auVar81);
  auVar21 = vfmadd231ps_fma(auVar75,auVar195,auVar83);
  auVar184._8_4_ = 0x7fffffff;
  auVar184._0_8_ = 0x7fffffff7fffffff;
  auVar184._12_4_ = 0x7fffffff;
  auVar82 = vandps_avx(auVar78,auVar184);
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar82,auVar181,1);
  bVar68 = (bool)((byte)uVar72 & 1);
  auVar84._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar78._0_4_;
  bVar68 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar78._4_4_;
  bVar68 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar78._8_4_;
  bVar68 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar78._12_4_;
  auVar82 = vandps_avx(auVar79,auVar184);
  uVar72 = vcmpps_avx512vl(auVar82,auVar181,1);
  bVar68 = (bool)((byte)uVar72 & 1);
  auVar78._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar79._0_4_;
  bVar68 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar79._4_4_;
  bVar68 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar79._8_4_;
  bVar68 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar79._12_4_;
  auVar82 = vandps_avx(auVar85,auVar184);
  uVar72 = vcmpps_avx512vl(auVar82,auVar181,1);
  bVar68 = (bool)((byte)uVar72 & 1);
  auVar79._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._0_4_;
  bVar68 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._4_4_;
  bVar68 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._8_4_;
  bVar68 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._12_4_;
  auVar80 = vrcp14ps_avx512vl(auVar84);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = &DAT_3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar84,auVar80,auVar182);
  auVar75 = vfmadd132ps_fma(auVar82,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar82 = vfnmadd213ps_fma(auVar78,auVar80,auVar182);
  auVar20 = vfmadd132ps_fma(auVar82,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar79);
  auVar82 = vfnmadd213ps_fma(auVar79,auVar80,auVar182);
  auVar83 = vfmadd132ps_fma(auVar82,auVar80,auVar80);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81 = vsubps_avx512vl(auVar82,auVar77);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar82 = vpmovsxwd_avx(auVar80);
  auVar174._0_4_ = auVar75._0_4_ * auVar81._0_4_;
  auVar174._4_4_ = auVar75._4_4_ * auVar81._4_4_;
  auVar174._8_4_ = auVar75._8_4_ * auVar81._8_4_;
  auVar174._12_4_ = auVar75._12_4_ * auVar81._12_4_;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx512vl(auVar82,auVar77);
  auVar164._0_4_ = auVar75._0_4_ * auVar82._0_4_;
  auVar164._4_4_ = auVar75._4_4_ * auVar82._4_4_;
  auVar164._8_4_ = auVar75._8_4_ * auVar82._8_4_;
  auVar164._12_4_ = auVar75._12_4_ * auVar82._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar80 = vpmovsxwd_avx(auVar75);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar65 * -2 + 6);
  auVar82 = vpmovsxwd_avx(auVar81);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar76);
  auVar185._0_4_ = auVar20._0_4_ * auVar82._0_4_;
  auVar185._4_4_ = auVar20._4_4_ * auVar82._4_4_;
  auVar185._8_4_ = auVar20._8_4_ * auVar82._8_4_;
  auVar185._12_4_ = auVar20._12_4_ * auVar82._12_4_;
  auVar82 = vcvtdq2ps_avx(auVar80);
  auVar82 = vsubps_avx(auVar82,auVar76);
  auVar143._0_4_ = auVar20._0_4_ * auVar82._0_4_;
  auVar143._4_4_ = auVar20._4_4_ * auVar82._4_4_;
  auVar143._8_4_ = auVar20._8_4_ * auVar82._8_4_;
  auVar143._12_4_ = auVar20._12_4_ * auVar82._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar69 + uVar65 + 6);
  auVar82 = vpmovsxwd_avx(auVar20);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar21);
  auVar153._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar153._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar153._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar153._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar65 * 0x17 + 6);
  auVar82 = vpmovsxwd_avx(auVar76);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar21);
  auVar135._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar135._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar135._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar135._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar82 = vpminsd_avx(auVar174,auVar164);
  auVar80 = vpminsd_avx(auVar185,auVar143);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80 = vpminsd_avx(auVar153,auVar135);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar83._4_4_ = uVar133;
  auVar83._0_4_ = uVar133;
  auVar83._8_4_ = uVar133;
  auVar83._12_4_ = uVar133;
  auVar80 = vmaxps_avx512vl(auVar80,auVar83);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar21._8_4_ = 0x3f7ffffa;
  auVar21._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar21._12_4_ = 0x3f7ffffa;
  local_330 = vmulps_avx512vl(auVar82,auVar21);
  auVar183 = ZEXT1664(local_330);
  auVar82 = vpmaxsd_avx(auVar174,auVar164);
  auVar149 = ZEXT1664(auVar82);
  auVar80 = vpmaxsd_avx(auVar185,auVar143);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar80 = vpmaxsd_avx(auVar153,auVar135);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar77._4_4_ = uVar133;
  auVar77._0_4_ = uVar133;
  auVar77._8_4_ = uVar133;
  auVar77._12_4_ = uVar133;
  auVar80 = vminps_avx512vl(auVar80,auVar77);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar22._8_4_ = 0x3f800003;
  auVar22._0_8_ = 0x3f8000033f800003;
  auVar22._12_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar22);
  auVar80 = vpbroadcastd_avx512vl();
  uVar141 = vcmpps_avx512vl(local_330,auVar82,2);
  uVar72 = vpcmpgtd_avx512vl(auVar80,_DAT_01ff0cf0);
  uVar72 = ((byte)uVar141 & 0xf) & uVar72;
  local_7b9 = (char)uVar72 != '\0';
  if (local_7b9) {
    local_628 = pre->ray_space + k;
    local_320 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar99 = local_520;
      auVar113 = auVar183._0_32_;
      auVar148 = auVar149._0_32_;
      local_5e0 = in_ZMM20._0_32_;
      lVar24 = 0;
      for (uVar65 = uVar72; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar70 = *(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[uVar70].ptr;
      uVar65 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar24 * 4 + 6));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar10[1].time_range.upper;
      auVar82 = *(undefined1 (*) [16])(lVar24 + (long)p_Var11 * uVar65);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar65 + 1) * (long)p_Var11);
      local_6d0 = *(ulong *)*pauVar3;
      uStack_6a8 = *(undefined8 *)(*pauVar3 + 8);
      auVar80 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar65 + 2) * (long)p_Var11);
      local_6c0 = *(undefined8 *)*pauVar4;
      uStack_6b8 = *(undefined8 *)(*pauVar4 + 8);
      auVar75 = *pauVar4;
      uVar72 = uVar72 - 1 & uVar72;
      pauVar5 = (undefined1 (*) [16])(lVar24 + (uVar65 + 3) * (long)p_Var11);
      local_640 = *(undefined8 *)*pauVar5;
      uStack_638 = *(undefined8 *)(*pauVar5 + 8);
      auVar81 = *pauVar5;
      if (uVar72 != 0) {
        uVar69 = uVar72 - 1 & uVar72;
        for (uVar65 = uVar72; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
        }
        if (uVar69 != 0) {
          for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar83 = vsubps_avx(auVar82,auVar20);
      uVar133 = auVar83._0_4_;
      auVar147._4_4_ = uVar133;
      auVar147._0_4_ = uVar133;
      auVar147._8_4_ = uVar133;
      auVar147._12_4_ = uVar133;
      auVar76 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      aVar6 = (local_628->vx).field_0;
      aVar7 = (local_628->vy).field_0;
      fVar162 = (local_628->vz).field_0.m128[0];
      fVar171 = *(float *)((long)&(local_628->vz).field_0 + 4);
      fVar172 = *(float *)((long)&(local_628->vz).field_0 + 8);
      fVar173 = *(float *)((long)&(local_628->vz).field_0 + 0xc);
      auVar188._0_4_ = fVar162 * auVar83._0_4_;
      auVar188._4_4_ = fVar171 * auVar83._4_4_;
      auVar188._8_4_ = fVar172 * auVar83._8_4_;
      auVar188._12_4_ = fVar173 * auVar83._12_4_;
      auVar76 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar7,auVar76);
      auVar77 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar6,auVar147);
      auVar76 = vshufps_avx(auVar82,auVar82,0xff);
      auVar21 = vsubps_avx(auVar80,auVar20);
      uVar133 = auVar21._0_4_;
      auVar154._4_4_ = uVar133;
      auVar154._0_4_ = uVar133;
      auVar154._8_4_ = uVar133;
      auVar154._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar189._0_4_ = fVar162 * auVar21._0_4_;
      auVar189._4_4_ = fVar171 * auVar21._4_4_;
      auVar189._8_4_ = fVar172 * auVar21._8_4_;
      auVar189._12_4_ = fVar173 * auVar21._12_4_;
      auVar83 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar7,auVar83);
      auVar22 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar6,auVar154);
      auVar80 = vshufps_avx(auVar80,auVar80,0xff);
      auVar21 = vsubps_avx(auVar75,auVar20);
      uVar133 = auVar21._0_4_;
      auVar186._4_4_ = uVar133;
      auVar186._0_4_ = uVar133;
      auVar186._8_4_ = uVar133;
      auVar186._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar192._0_4_ = fVar162 * auVar21._0_4_;
      auVar192._4_4_ = fVar171 * auVar21._4_4_;
      auVar192._8_4_ = fVar172 * auVar21._8_4_;
      auVar192._12_4_ = fVar173 * auVar21._12_4_;
      auVar83 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar83);
      auVar21 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar6,auVar186);
      auVar75 = vshufps_avx(auVar75,auVar75,0xff);
      auVar83 = vsubps_avx512vl(auVar81,auVar20);
      uVar133 = auVar83._0_4_;
      auVar155._4_4_ = uVar133;
      auVar155._0_4_ = uVar133;
      auVar155._8_4_ = uVar133;
      auVar155._12_4_ = uVar133;
      auVar20 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar193._0_4_ = fVar162 * auVar83._0_4_;
      auVar193._4_4_ = fVar171 * auVar83._4_4_;
      auVar193._8_4_ = fVar172 * auVar83._8_4_;
      auVar193._12_4_ = fVar173 * auVar83._12_4_;
      auVar20 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar7,auVar20);
      auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar155);
      lVar24 = (long)iVar9 * 0x44;
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      auVar83 = vshufps_avx512vl(auVar81,auVar81,0xff);
      local_5a0 = vbroadcastss_avx512vl(auVar77);
      auVar86._8_4_ = 1;
      auVar86._0_8_ = 0x100000001;
      auVar86._12_4_ = 1;
      auVar86._16_4_ = 1;
      auVar86._20_4_ = 1;
      auVar86._24_4_ = 1;
      auVar86._28_4_ = 1;
      local_680 = vpermps_avx512vl(auVar86,ZEXT1632(auVar77));
      uVar141 = auVar76._0_8_;
      local_80._8_8_ = uVar141;
      local_80._0_8_ = uVar141;
      local_80._16_8_ = uVar141;
      local_80._24_8_ = uVar141;
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      uVar133 = auVar22._0_4_;
      local_6a0._4_4_ = uVar133;
      local_6a0._0_4_ = uVar133;
      local_6a0._8_4_ = uVar133;
      local_6a0._12_4_ = uVar133;
      local_6a0._16_4_ = uVar133;
      local_6a0._20_4_ = uVar133;
      local_6a0._24_4_ = uVar133;
      local_6a0._28_4_ = uVar133;
      local_300 = vpermps_avx512vl(auVar86,ZEXT1632(auVar22));
      uVar141 = auVar80._0_8_;
      local_a0._8_8_ = uVar141;
      local_a0._0_8_ = uVar141;
      local_a0._16_8_ = uVar141;
      local_a0._24_8_ = uVar141;
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_c0 = vbroadcastss_avx512vl(auVar21);
      local_e0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar21));
      local_100 = vbroadcastsd_avx512vl(auVar75);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_120 = vbroadcastss_avx512vl(auVar20);
      local_140 = vpermps_avx512vl(auVar86,ZEXT1632(auVar20));
      _local_160 = vbroadcastsd_avx512vl(auVar83);
      auVar86 = vmulps_avx512vl(local_120,auVar100);
      auVar87 = vmulps_avx512vl(local_140,auVar100);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar102,local_c0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_e0);
      auVar80 = vfmadd231ps_fma(auVar86,auVar104,local_6a0);
      auVar88 = vfmadd231ps_avx512vl(auVar87,auVar104,local_300);
      auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar101,local_5a0);
      auVar86 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar87 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar101,local_680);
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar91 = vmulps_avx512vl(local_120,auVar103);
      auVar92 = vmulps_avx512vl(local_140,auVar103);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_e0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_6a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,local_300);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_5a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar86,local_680);
      auVar93 = vsubps_avx512vl(auVar91,auVar89);
      auVar94 = vsubps_avx512vl(auVar92,auVar90);
      auVar95 = vmulps_avx512vl(auVar90,auVar93);
      auVar96 = vmulps_avx512vl(auVar89,auVar94);
      auVar95 = vsubps_avx512vl(auVar95,auVar96);
      auVar96 = vmulps_avx512vl(_local_160,auVar100);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_100);
      auVar80 = vfmadd231ps_fma(auVar96,auVar104,local_a0);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar101,local_80);
      auVar97 = vmulps_avx512vl(_local_160,auVar103);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,local_100);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar87,local_a0);
      auVar76 = vfmadd231ps_fma(auVar97,auVar86,local_80);
      auVar97 = vmulps_avx512vl(auVar94,auVar94);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar93);
      auVar98 = vmaxps_avx512vl(auVar96,ZEXT1632(auVar76));
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      auVar97 = vmulps_avx512vl(auVar98,auVar97);
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      uVar141 = vcmpps_avx512vl(auVar95,auVar97,2);
      auVar80 = vblendps_avx(auVar77,auVar82,8);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar75 = vandps_avx512vl(auVar80,auVar83);
      auVar80 = vblendps_avx(auVar22,*pauVar3,8);
      auVar80 = vandps_avx512vl(auVar80,auVar83);
      auVar75 = vmaxps_avx(auVar75,auVar80);
      auVar80 = vblendps_avx(auVar21,*pauVar4,8);
      auVar84 = vandps_avx512vl(auVar80,auVar83);
      auVar80 = vblendps_avx(auVar20,auVar81,8);
      auVar80 = vandps_avx512vl(auVar80,auVar83);
      auVar80 = vmaxps_avx(auVar84,auVar80);
      auVar80 = vmaxps_avx(auVar75,auVar80);
      auVar75 = vmovshdup_avx(auVar80);
      auVar75 = vmaxss_avx(auVar75,auVar80);
      auVar80 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vmaxss_avx(auVar80,auVar75);
      auVar95._0_4_ = (float)iVar9;
      local_520._4_12_ = auVar77._4_12_;
      local_520._0_4_ = auVar95._0_4_;
      local_520._16_16_ = auVar99._16_16_;
      auVar95._4_4_ = auVar95._0_4_;
      auVar95._8_4_ = auVar95._0_4_;
      auVar95._12_4_ = auVar95._0_4_;
      auVar95._16_4_ = auVar95._0_4_;
      auVar95._20_4_ = auVar95._0_4_;
      auVar95._24_4_ = auVar95._0_4_;
      auVar95._28_4_ = auVar95._0_4_;
      uVar23 = vcmpps_avx512vl(auVar95,_DAT_02020f40,0xe);
      local_450 = (byte)uVar141 & (byte)uVar23;
      local_540 = auVar80._0_4_ * 4.7683716e-07;
      auVar99._8_4_ = 2;
      auVar99._0_8_ = 0x200000002;
      auVar99._12_4_ = 2;
      auVar99._16_4_ = 2;
      auVar99._20_4_ = 2;
      auVar99._24_4_ = 2;
      auVar99._28_4_ = 2;
      local_180 = vpermps_avx512vl(auVar99,ZEXT1632(auVar77));
      local_1a0 = vpermps_avx512vl(auVar99,ZEXT1632(auVar22));
      local_1c0 = vpermps_avx512vl(auVar99,ZEXT1632(auVar21));
      local_5c0 = vpermps_avx2(auVar99,ZEXT1632(auVar20));
      uVar191 = *(uint *)(ray + k * 4 + 0x60);
      auVar80 = local_c0._0_16_;
      local_700 = ZEXT416((uint)local_540);
      local_6b0 = local_6d0;
      if (local_450 == 0) {
        bVar68 = false;
        auVar80 = vxorps_avx512vl(auVar80,auVar80);
        auVar203 = ZEXT1664(auVar80);
        auVar183 = ZEXT3264(auVar113);
        in_ZMM20 = ZEXT3264(local_5e0);
        auVar149 = ZEXT3264(auVar148);
        auVar201 = ZEXT3264(local_600);
        auVar202 = ZEXT3264(local_5a0);
        auVar200 = ZEXT3264(local_680);
        auVar199 = ZEXT3264(local_6a0);
      }
      else {
        local_620._0_16_ = ZEXT416(uVar191);
        auVar99 = vmulps_avx512vl(local_5c0,auVar103);
        auVar99 = vfmadd213ps_avx512vl(auVar88,local_1c0,auVar99);
        auVar99 = vfmadd213ps_avx512vl(auVar87,local_1a0,auVar99);
        auVar86 = vfmadd213ps_avx512vl(auVar86,local_180,auVar99);
        auVar99 = vmulps_avx512vl(local_5c0,auVar100);
        auVar99 = vfmadd213ps_avx512vl(auVar102,local_1c0,auVar99);
        auVar87 = vfmadd213ps_avx512vl(auVar104,local_1a0,auVar99);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar100 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar97 = vfmadd213ps_avx512vl(auVar101,local_180,auVar87);
        auVar87 = vmulps_avx512vl(local_120,auVar100);
        auVar88 = vmulps_avx512vl(local_140,auVar100);
        auVar101._4_4_ = local_5c0._4_4_ * auVar100._4_4_;
        auVar101._0_4_ = local_5c0._0_4_ * auVar100._0_4_;
        auVar101._8_4_ = local_5c0._8_4_ * auVar100._8_4_;
        auVar101._12_4_ = local_5c0._12_4_ * auVar100._12_4_;
        auVar101._16_4_ = local_5c0._16_4_ * auVar100._16_4_;
        auVar101._20_4_ = local_5c0._20_4_ * auVar100._20_4_;
        auVar101._24_4_ = local_5c0._24_4_ * auVar100._24_4_;
        auVar101._28_4_ = auVar100._28_4_;
        auVar100 = vfmadd231ps_avx512vl(auVar87,auVar102,local_c0);
        auVar87 = vfmadd231ps_avx512vl(auVar88,auVar102,local_e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_1c0,auVar102);
        auVar102 = vfmadd231ps_avx512vl(auVar100,auVar104,local_6a0);
        auVar100 = vfmadd231ps_avx512vl(auVar87,auVar104,local_300);
        auVar87 = vfmadd231ps_avx512vl(auVar101,local_1a0,auVar104);
        auVar88 = vfmadd231ps_avx512vl(auVar102,auVar99,local_5a0);
        auVar200 = ZEXT3264(local_680);
        auVar103 = vfmadd231ps_avx512vl(auVar100,auVar99,local_680);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar87 = vfmadd231ps_avx512vl(auVar87,local_180,auVar99);
        auVar99 = vmulps_avx512vl(local_120,auVar102);
        auVar98 = vmulps_avx512vl(local_140,auVar102);
        auVar100._4_4_ = local_5c0._4_4_ * auVar102._4_4_;
        auVar100._0_4_ = local_5c0._0_4_ * auVar102._0_4_;
        auVar100._8_4_ = local_5c0._8_4_ * auVar102._8_4_;
        auVar100._12_4_ = local_5c0._12_4_ * auVar102._12_4_;
        auVar100._16_4_ = local_5c0._16_4_ * auVar102._16_4_;
        auVar100._20_4_ = local_5c0._20_4_ * auVar102._20_4_;
        auVar100._24_4_ = local_5c0._24_4_ * auVar102._24_4_;
        auVar100._28_4_ = auVar102._28_4_;
        auVar102 = vfmadd231ps_avx512vl(auVar99,auVar104,local_c0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_e0);
        auVar104 = vfmadd231ps_avx512vl(auVar100,local_1c0,auVar104);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,local_6a0);
        auVar100 = vfmadd231ps_avx512vl(auVar98,auVar99,local_300);
        auVar99 = vfmadd231ps_avx512vl(auVar104,local_1a0,auVar99);
        auVar104 = vfmadd231ps_avx512vl(auVar102,auVar101,local_5a0);
        auVar102 = vfmadd231ps_avx512vl(auVar100,auVar101,local_680);
        auVar100 = vfmadd231ps_avx512vl(auVar99,local_180,auVar101);
        auVar197._8_4_ = 0x7fffffff;
        auVar197._0_8_ = 0x7fffffff7fffffff;
        auVar197._12_4_ = 0x7fffffff;
        auVar197._16_4_ = 0x7fffffff;
        auVar197._20_4_ = 0x7fffffff;
        auVar197._24_4_ = 0x7fffffff;
        auVar197._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(auVar88,auVar197);
        auVar101 = vandps_avx(auVar103,auVar197);
        auVar101 = vmaxps_avx(auVar99,auVar101);
        auVar99 = vandps_avx(auVar87,auVar197);
        auVar99 = vmaxps_avx(auVar101,auVar99);
        auVar87 = vbroadcastss_avx512vl(local_700);
        uVar65 = vcmpps_avx512vl(auVar99,auVar87,1);
        bVar68 = (bool)((byte)uVar65 & 1);
        auVar98._0_4_ = (float)((uint)bVar68 * auVar93._0_4_ | (uint)!bVar68 * auVar88._0_4_);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar68 * auVar93._4_4_ | (uint)!bVar68 * auVar88._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar68 * auVar93._8_4_ | (uint)!bVar68 * auVar88._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar68 * auVar93._12_4_ | (uint)!bVar68 * auVar88._12_4_);
        bVar68 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar68 * auVar93._16_4_ | (uint)!bVar68 * auVar88._16_4_);
        bVar68 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar68 * auVar93._20_4_ | (uint)!bVar68 * auVar88._20_4_);
        bVar68 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar68 * auVar93._24_4_ | (uint)!bVar68 * auVar88._24_4_);
        bVar68 = SUB81(uVar65 >> 7,0);
        auVar98._28_4_ = (uint)bVar68 * auVar93._28_4_ | (uint)!bVar68 * auVar88._28_4_;
        bVar68 = (bool)((byte)uVar65 & 1);
        auVar105._0_4_ = (float)((uint)bVar68 * auVar94._0_4_ | (uint)!bVar68 * auVar103._0_4_);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar68 * auVar94._4_4_ | (uint)!bVar68 * auVar103._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar68 * auVar94._8_4_ | (uint)!bVar68 * auVar103._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar68 * auVar94._12_4_ | (uint)!bVar68 * auVar103._12_4_);
        bVar68 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar68 * auVar94._16_4_ | (uint)!bVar68 * auVar103._16_4_);
        bVar68 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar68 * auVar94._20_4_ | (uint)!bVar68 * auVar103._20_4_);
        bVar68 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar68 * auVar94._24_4_ | (uint)!bVar68 * auVar103._24_4_);
        bVar68 = SUB81(uVar65 >> 7,0);
        auVar105._28_4_ = (uint)bVar68 * auVar94._28_4_ | (uint)!bVar68 * auVar103._28_4_;
        auVar99 = vandps_avx(auVar197,auVar104);
        auVar101 = vandps_avx(auVar102,auVar197);
        auVar101 = vmaxps_avx(auVar99,auVar101);
        auVar99 = vandps_avx(auVar100,auVar197);
        auVar99 = vmaxps_avx(auVar101,auVar99);
        uVar65 = vcmpps_avx512vl(auVar99,auVar87,1);
        bVar68 = (bool)((byte)uVar65 & 1);
        auVar106._0_4_ = (float)((uint)bVar68 * auVar93._0_4_ | (uint)!bVar68 * auVar104._0_4_);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar68 * auVar93._4_4_ | (uint)!bVar68 * auVar104._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar68 * auVar93._8_4_ | (uint)!bVar68 * auVar104._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar68 * auVar93._12_4_ | (uint)!bVar68 * auVar104._12_4_);
        bVar68 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar68 * auVar93._16_4_ | (uint)!bVar68 * auVar104._16_4_);
        bVar68 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar68 * auVar93._20_4_ | (uint)!bVar68 * auVar104._20_4_);
        bVar68 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar68 * auVar93._24_4_ | (uint)!bVar68 * auVar104._24_4_);
        bVar68 = SUB81(uVar65 >> 7,0);
        auVar106._28_4_ = (uint)bVar68 * auVar93._28_4_ | (uint)!bVar68 * auVar104._28_4_;
        bVar68 = (bool)((byte)uVar65 & 1);
        auVar107._0_4_ = (float)((uint)bVar68 * auVar94._0_4_ | (uint)!bVar68 * auVar102._0_4_);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar68 * auVar94._4_4_ | (uint)!bVar68 * auVar102._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar68 * auVar94._8_4_ | (uint)!bVar68 * auVar102._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar68 * auVar94._12_4_ | (uint)!bVar68 * auVar102._12_4_);
        bVar68 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar68 * auVar94._16_4_ | (uint)!bVar68 * auVar102._16_4_);
        bVar68 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar68 * auVar94._20_4_ | (uint)!bVar68 * auVar102._20_4_);
        bVar68 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar68 * auVar94._24_4_ | (uint)!bVar68 * auVar102._24_4_);
        bVar68 = SUB81(uVar65 >> 7,0);
        auVar107._28_4_ = (uint)bVar68 * auVar94._28_4_ | (uint)!bVar68 * auVar102._28_4_;
        auVar85 = vxorps_avx512vl(auVar80,auVar80);
        auVar203 = ZEXT1664(auVar85);
        auVar99 = vfmadd213ps_avx512vl(auVar98,auVar98,ZEXT1632(auVar85));
        auVar80 = vfmadd231ps_fma(auVar99,auVar105,auVar105);
        auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar162 = auVar99._0_4_;
        fVar171 = auVar99._4_4_;
        fVar172 = auVar99._8_4_;
        fVar173 = auVar99._12_4_;
        fVar150 = auVar99._16_4_;
        fVar161 = auVar99._20_4_;
        fVar73 = auVar99._24_4_;
        auVar104._4_4_ = fVar171 * fVar171 * fVar171 * auVar80._4_4_ * -0.5;
        auVar104._0_4_ = fVar162 * fVar162 * fVar162 * auVar80._0_4_ * -0.5;
        auVar104._8_4_ = fVar172 * fVar172 * fVar172 * auVar80._8_4_ * -0.5;
        auVar104._12_4_ = fVar173 * fVar173 * fVar173 * auVar80._12_4_ * -0.5;
        auVar104._16_4_ = fVar150 * fVar150 * fVar150 * -0.0;
        auVar104._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar104._24_4_ = fVar73 * fVar73 * fVar73 * -0.0;
        auVar104._28_4_ = 0;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar99);
        auVar102._4_4_ = auVar105._4_4_ * auVar104._4_4_;
        auVar102._0_4_ = auVar105._0_4_ * auVar104._0_4_;
        auVar102._8_4_ = auVar105._8_4_ * auVar104._8_4_;
        auVar102._12_4_ = auVar105._12_4_ * auVar104._12_4_;
        auVar102._16_4_ = auVar105._16_4_ * auVar104._16_4_;
        auVar102._20_4_ = auVar105._20_4_ * auVar104._20_4_;
        auVar102._24_4_ = auVar105._24_4_ * auVar104._24_4_;
        auVar102._28_4_ = auVar99._28_4_;
        auVar87._4_4_ = auVar104._4_4_ * -auVar98._4_4_;
        auVar87._0_4_ = auVar104._0_4_ * -auVar98._0_4_;
        auVar87._8_4_ = auVar104._8_4_ * -auVar98._8_4_;
        auVar87._12_4_ = auVar104._12_4_ * -auVar98._12_4_;
        auVar87._16_4_ = auVar104._16_4_ * -auVar98._16_4_;
        auVar87._20_4_ = auVar104._20_4_ * -auVar98._20_4_;
        auVar87._24_4_ = auVar104._24_4_ * -auVar98._24_4_;
        auVar87._28_4_ = auVar98._28_4_ ^ 0x80000000;
        auVar99 = vmulps_avx512vl(auVar104,ZEXT1632(auVar85));
        auVar94 = ZEXT1632(auVar85);
        auVar100 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar94);
        auVar80 = vfmadd231ps_fma(auVar100,auVar107,auVar107);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar162 = auVar100._0_4_;
        fVar171 = auVar100._4_4_;
        fVar172 = auVar100._8_4_;
        fVar173 = auVar100._12_4_;
        fVar150 = auVar100._16_4_;
        fVar161 = auVar100._20_4_;
        fVar73 = auVar100._24_4_;
        auVar88._4_4_ = fVar171 * fVar171 * fVar171 * auVar80._4_4_ * -0.5;
        auVar88._0_4_ = fVar162 * fVar162 * fVar162 * auVar80._0_4_ * -0.5;
        auVar88._8_4_ = fVar172 * fVar172 * fVar172 * auVar80._8_4_ * -0.5;
        auVar88._12_4_ = fVar173 * fVar173 * fVar173 * auVar80._12_4_ * -0.5;
        auVar88._16_4_ = fVar150 * fVar150 * fVar150 * -0.0;
        auVar88._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar88._24_4_ = fVar73 * fVar73 * fVar73 * -0.0;
        auVar88._28_4_ = 0;
        auVar101 = vfmadd231ps_avx512vl(auVar88,auVar101,auVar100);
        auVar103._4_4_ = auVar107._4_4_ * auVar101._4_4_;
        auVar103._0_4_ = auVar107._0_4_ * auVar101._0_4_;
        auVar103._8_4_ = auVar107._8_4_ * auVar101._8_4_;
        auVar103._12_4_ = auVar107._12_4_ * auVar101._12_4_;
        auVar103._16_4_ = auVar107._16_4_ * auVar101._16_4_;
        auVar103._20_4_ = auVar107._20_4_ * auVar101._20_4_;
        auVar103._24_4_ = auVar107._24_4_ * auVar101._24_4_;
        auVar103._28_4_ = auVar100._28_4_;
        auVar93._4_4_ = -auVar106._4_4_ * auVar101._4_4_;
        auVar93._0_4_ = -auVar106._0_4_ * auVar101._0_4_;
        auVar93._8_4_ = -auVar106._8_4_ * auVar101._8_4_;
        auVar93._12_4_ = -auVar106._12_4_ * auVar101._12_4_;
        auVar93._16_4_ = -auVar106._16_4_ * auVar101._16_4_;
        auVar93._20_4_ = -auVar106._20_4_ * auVar101._20_4_;
        auVar93._24_4_ = -auVar106._24_4_ * auVar101._24_4_;
        auVar93._28_4_ = auVar104._28_4_;
        auVar101 = vmulps_avx512vl(auVar101,auVar94);
        auVar80 = vfmadd213ps_fma(auVar102,auVar96,auVar89);
        auVar75 = vfmadd213ps_fma(auVar87,auVar96,auVar90);
        auVar104 = vfmadd213ps_avx512vl(auVar99,auVar96,auVar97);
        auVar100 = vfmadd213ps_avx512vl(auVar103,ZEXT1632(auVar76),auVar91);
        auVar77 = vfnmadd213ps_fma(auVar102,auVar96,auVar89);
        auVar88 = ZEXT1632(auVar76);
        auVar81 = vfmadd213ps_fma(auVar93,auVar88,auVar92);
        auVar22 = vfnmadd213ps_fma(auVar87,auVar96,auVar90);
        auVar20 = vfmadd213ps_fma(auVar101,auVar88,auVar86);
        auVar102 = vfnmadd231ps_avx512vl(auVar97,auVar96,auVar99);
        auVar84 = vfnmadd213ps_fma(auVar103,auVar88,auVar91);
        auVar79 = vfnmadd213ps_fma(auVar93,auVar88,auVar92);
        auVar78 = vfnmadd231ps_fma(auVar86,ZEXT1632(auVar76),auVar101);
        auVar101 = vsubps_avx512vl(auVar100,ZEXT1632(auVar77));
        auVar99 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar22));
        auVar86 = vsubps_avx512vl(ZEXT1632(auVar20),auVar102);
        auVar87 = vmulps_avx512vl(auVar99,auVar102);
        auVar83 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar22),auVar86);
        auVar89._4_4_ = auVar77._4_4_ * auVar86._4_4_;
        auVar89._0_4_ = auVar77._0_4_ * auVar86._0_4_;
        auVar89._8_4_ = auVar77._8_4_ * auVar86._8_4_;
        auVar89._12_4_ = auVar77._12_4_ * auVar86._12_4_;
        auVar89._16_4_ = auVar86._16_4_ * 0.0;
        auVar89._20_4_ = auVar86._20_4_ * 0.0;
        auVar89._24_4_ = auVar86._24_4_ * 0.0;
        auVar89._28_4_ = auVar86._28_4_;
        auVar86 = vfmsub231ps_avx512vl(auVar89,auVar102,auVar101);
        auVar90._4_4_ = auVar22._4_4_ * auVar101._4_4_;
        auVar90._0_4_ = auVar22._0_4_ * auVar101._0_4_;
        auVar90._8_4_ = auVar22._8_4_ * auVar101._8_4_;
        auVar90._12_4_ = auVar22._12_4_ * auVar101._12_4_;
        auVar90._16_4_ = auVar101._16_4_ * 0.0;
        auVar90._20_4_ = auVar101._20_4_ * 0.0;
        auVar90._24_4_ = auVar101._24_4_ * 0.0;
        auVar90._28_4_ = auVar101._28_4_;
        auVar21 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar77),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar94,auVar86);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar83));
        auVar93 = ZEXT1632(auVar85);
        uVar65 = vcmpps_avx512vl(auVar99,auVar93,2);
        bVar67 = (byte)uVar65;
        fVar73 = (float)((uint)(bVar67 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar84._0_4_);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        fVar124 = (float)((uint)bVar68 * auVar80._4_4_ | (uint)!bVar68 * auVar84._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        fVar126 = (float)((uint)bVar68 * auVar80._8_4_ | (uint)!bVar68 * auVar84._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        fVar129 = (float)((uint)bVar68 * auVar80._12_4_ | (uint)!bVar68 * auVar84._12_4_);
        auVar87 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar124,fVar73))));
        fVar74 = (float)((uint)(bVar67 & 1) * auVar75._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar79._0_4_);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        fVar125 = (float)((uint)bVar68 * auVar75._4_4_ | (uint)!bVar68 * auVar79._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        fVar127 = (float)((uint)bVar68 * auVar75._8_4_ | (uint)!bVar68 * auVar79._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        fVar130 = (float)((uint)bVar68 * auVar75._12_4_ | (uint)!bVar68 * auVar79._12_4_);
        auVar88 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar125,fVar74))));
        auVar97._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar78._0_4_
                    );
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar68 * auVar104._4_4_ | (uint)!bVar68 * auVar78._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar68 * auVar104._8_4_ | (uint)!bVar68 * auVar78._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar68 * auVar104._12_4_ | (uint)!bVar68 * auVar78._12_4_);
        fVar171 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar104._16_4_);
        auVar97._16_4_ = fVar171;
        fVar162 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar104._20_4_);
        auVar97._20_4_ = fVar162;
        fVar172 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar104._24_4_);
        auVar97._24_4_ = fVar172;
        iVar1 = (uint)(byte)(uVar65 >> 7) * auVar104._28_4_;
        auVar97._28_4_ = iVar1;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar100);
        auVar108._0_4_ =
             (uint)(bVar67 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar83._0_4_;
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar68 * auVar101._4_4_ | (uint)!bVar68 * auVar83._4_4_;
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar68 * auVar101._8_4_ | (uint)!bVar68 * auVar83._8_4_;
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar68 * auVar101._12_4_ | (uint)!bVar68 * auVar83._12_4_;
        auVar108._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar101._16_4_;
        auVar108._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar101._20_4_;
        auVar108._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar101._24_4_;
        auVar108._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar81));
        auVar109._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar75._0_4_
                    );
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar68 * auVar101._4_4_ | (uint)!bVar68 * auVar75._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar68 * auVar101._8_4_ | (uint)!bVar68 * auVar75._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar68 * auVar101._12_4_ | (uint)!bVar68 * auVar75._12_4_);
        fVar173 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar101._16_4_);
        auVar109._16_4_ = fVar173;
        fVar150 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar101._20_4_);
        auVar109._20_4_ = fVar150;
        fVar161 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar101._24_4_);
        auVar109._24_4_ = fVar161;
        auVar109._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar20));
        auVar110._0_4_ =
             (float)((uint)(bVar67 & 1) * auVar101._0_4_ |
                    (uint)!(bool)(bVar67 & 1) * auVar104._0_4_);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar68 * auVar101._4_4_ | (uint)!bVar68 * auVar104._4_4_);
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar68 * auVar101._8_4_ | (uint)!bVar68 * auVar104._8_4_);
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar68 * auVar101._12_4_ | (uint)!bVar68 * auVar104._12_4_);
        bVar68 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar68 * auVar101._16_4_ | (uint)!bVar68 * auVar104._16_4_);
        bVar68 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar68 * auVar101._20_4_ | (uint)!bVar68 * auVar104._20_4_);
        bVar68 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar68 * auVar101._24_4_ | (uint)!bVar68 * auVar104._24_4_);
        bVar68 = SUB81(uVar65 >> 7,0);
        auVar110._28_4_ = (uint)bVar68 * auVar101._28_4_ | (uint)!bVar68 * auVar104._28_4_;
        auVar111._0_4_ =
             (uint)(bVar67 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar100._0_4_;
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar68 * (int)auVar77._4_4_ | (uint)!bVar68 * auVar100._4_4_;
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar68 * (int)auVar77._8_4_ | (uint)!bVar68 * auVar100._8_4_;
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar68 * (int)auVar77._12_4_ | (uint)!bVar68 * auVar100._12_4_;
        auVar111._16_4_ = (uint)!(bool)((byte)(uVar65 >> 4) & 1) * auVar100._16_4_;
        auVar111._20_4_ = (uint)!(bool)((byte)(uVar65 >> 5) & 1) * auVar100._20_4_;
        auVar111._24_4_ = (uint)!(bool)((byte)(uVar65 >> 6) & 1) * auVar100._24_4_;
        auVar111._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar100._28_4_;
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar112._0_4_ =
             (uint)(bVar67 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar20._0_4_;
        bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar20._4_4_;
        bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar20._8_4_;
        bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar20._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar102._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar102._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar102._24_4_;
        iVar2 = (uint)(byte)(uVar65 >> 7) * auVar102._28_4_;
        auVar112._28_4_ = iVar2;
        auVar103 = vsubps_avx512vl(auVar111,auVar87);
        auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar22._12_4_ |
                                                 (uint)!bVar14 * auVar81._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar22._8_4_ |
                                                          (uint)!bVar13 * auVar81._8_4_,
                                                          CONCAT44((uint)bVar68 * (int)auVar22._4_4_
                                                                   | (uint)!bVar68 * auVar81._4_4_,
                                                                   (uint)(bVar67 & 1) *
                                                                   (int)auVar22._0_4_ |
                                                                   (uint)!(bool)(bVar67 & 1) *
                                                                   auVar81._0_4_)))),auVar88);
        auVar104 = vsubps_avx(auVar112,auVar97);
        auVar102 = vsubps_avx(auVar87,auVar108);
        auVar100 = vsubps_avx(auVar88,auVar109);
        auVar86 = vsubps_avx(auVar97,auVar110);
        auVar91._4_4_ = auVar104._4_4_ * fVar124;
        auVar91._0_4_ = auVar104._0_4_ * fVar73;
        auVar91._8_4_ = auVar104._8_4_ * fVar126;
        auVar91._12_4_ = auVar104._12_4_ * fVar129;
        auVar91._16_4_ = auVar104._16_4_ * 0.0;
        auVar91._20_4_ = auVar104._20_4_ * 0.0;
        auVar91._24_4_ = auVar104._24_4_ * 0.0;
        auVar91._28_4_ = iVar2;
        auVar80 = vfmsub231ps_fma(auVar91,auVar97,auVar103);
        auVar92._4_4_ = fVar125 * auVar103._4_4_;
        auVar92._0_4_ = fVar74 * auVar103._0_4_;
        auVar92._8_4_ = fVar127 * auVar103._8_4_;
        auVar92._12_4_ = fVar130 * auVar103._12_4_;
        auVar92._16_4_ = auVar103._16_4_ * 0.0;
        auVar92._20_4_ = auVar103._20_4_ * 0.0;
        auVar92._24_4_ = auVar103._24_4_ * 0.0;
        auVar92._28_4_ = auVar99._28_4_;
        auVar75 = vfmsub231ps_fma(auVar92,auVar87,auVar101);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar93,ZEXT1632(auVar80));
        auVar165._0_4_ = auVar101._0_4_ * auVar97._0_4_;
        auVar165._4_4_ = auVar101._4_4_ * auVar97._4_4_;
        auVar165._8_4_ = auVar101._8_4_ * auVar97._8_4_;
        auVar165._12_4_ = auVar101._12_4_ * auVar97._12_4_;
        auVar165._16_4_ = auVar101._16_4_ * fVar171;
        auVar165._20_4_ = auVar101._20_4_ * fVar162;
        auVar165._24_4_ = auVar101._24_4_ * fVar172;
        auVar165._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar165,auVar88,auVar104);
        auVar89 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar80));
        auVar99 = vmulps_avx512vl(auVar86,auVar108);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar102,auVar110);
        auVar94._4_4_ = auVar100._4_4_ * auVar110._4_4_;
        auVar94._0_4_ = auVar100._0_4_ * auVar110._0_4_;
        auVar94._8_4_ = auVar100._8_4_ * auVar110._8_4_;
        auVar94._12_4_ = auVar100._12_4_ * auVar110._12_4_;
        auVar94._16_4_ = auVar100._16_4_ * auVar110._16_4_;
        auVar94._20_4_ = auVar100._20_4_ * auVar110._20_4_;
        auVar94._24_4_ = auVar100._24_4_ * auVar110._24_4_;
        auVar94._28_4_ = auVar110._28_4_;
        auVar80 = vfmsub231ps_fma(auVar94,auVar109,auVar86);
        auVar166._0_4_ = auVar109._0_4_ * auVar102._0_4_;
        auVar166._4_4_ = auVar109._4_4_ * auVar102._4_4_;
        auVar166._8_4_ = auVar109._8_4_ * auVar102._8_4_;
        auVar166._12_4_ = auVar109._12_4_ * auVar102._12_4_;
        auVar166._16_4_ = fVar173 * auVar102._16_4_;
        auVar166._20_4_ = fVar150 * auVar102._20_4_;
        auVar166._24_4_ = fVar161 * auVar102._24_4_;
        auVar166._28_4_ = 0;
        auVar75 = vfmsub231ps_fma(auVar166,auVar100,auVar108);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar93,auVar99);
        auVar90 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar80));
        auVar99 = vmaxps_avx(auVar89,auVar90);
        uVar141 = vcmpps_avx512vl(auVar99,auVar93,2);
        local_450 = local_450 & (byte)uVar141;
        in_ZMM20 = ZEXT3264(local_5e0);
        auVar202 = ZEXT3264(local_5a0);
        auVar199 = ZEXT3264(local_6a0);
        auVar196 = ZEXT1664(local_700);
        if (local_450 == 0) {
          local_450 = 0;
          auVar183 = ZEXT3264(auVar113);
          auVar149 = ZEXT3264(auVar148);
        }
        else {
          auVar33._4_4_ = auVar86._4_4_ * auVar101._4_4_;
          auVar33._0_4_ = auVar86._0_4_ * auVar101._0_4_;
          auVar33._8_4_ = auVar86._8_4_ * auVar101._8_4_;
          auVar33._12_4_ = auVar86._12_4_ * auVar101._12_4_;
          auVar33._16_4_ = auVar86._16_4_ * auVar101._16_4_;
          auVar33._20_4_ = auVar86._20_4_ * auVar101._20_4_;
          auVar33._24_4_ = auVar86._24_4_ * auVar101._24_4_;
          auVar33._28_4_ = auVar99._28_4_;
          auVar81 = vfmsub231ps_fma(auVar33,auVar100,auVar104);
          auVar34._4_4_ = auVar104._4_4_ * auVar102._4_4_;
          auVar34._0_4_ = auVar104._0_4_ * auVar102._0_4_;
          auVar34._8_4_ = auVar104._8_4_ * auVar102._8_4_;
          auVar34._12_4_ = auVar104._12_4_ * auVar102._12_4_;
          auVar34._16_4_ = auVar104._16_4_ * auVar102._16_4_;
          auVar34._20_4_ = auVar104._20_4_ * auVar102._20_4_;
          auVar34._24_4_ = auVar104._24_4_ * auVar102._24_4_;
          auVar34._28_4_ = auVar104._28_4_;
          auVar75 = vfmsub231ps_fma(auVar34,auVar103,auVar86);
          auVar35._4_4_ = auVar100._4_4_ * auVar103._4_4_;
          auVar35._0_4_ = auVar100._0_4_ * auVar103._0_4_;
          auVar35._8_4_ = auVar100._8_4_ * auVar103._8_4_;
          auVar35._12_4_ = auVar100._12_4_ * auVar103._12_4_;
          auVar35._16_4_ = auVar100._16_4_ * auVar103._16_4_;
          auVar35._20_4_ = auVar100._20_4_ * auVar103._20_4_;
          auVar35._24_4_ = auVar100._24_4_ * auVar103._24_4_;
          auVar35._28_4_ = auVar100._28_4_;
          auVar20 = vfmsub231ps_fma(auVar35,auVar102,auVar101);
          auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar75),ZEXT1632(auVar20));
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar81),auVar93);
          auVar101 = vrcp14ps_avx512vl(auVar99);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar104 = vfnmadd213ps_avx512vl(auVar101,auVar99,auVar26);
          auVar80 = vfmadd132ps_fma(auVar104,auVar101,auVar101);
          auVar36._4_4_ = auVar20._4_4_ * auVar97._4_4_;
          auVar36._0_4_ = auVar20._0_4_ * auVar97._0_4_;
          auVar36._8_4_ = auVar20._8_4_ * auVar97._8_4_;
          auVar36._12_4_ = auVar20._12_4_ * auVar97._12_4_;
          auVar36._16_4_ = fVar171 * 0.0;
          auVar36._20_4_ = fVar162 * 0.0;
          auVar36._24_4_ = fVar172 * 0.0;
          auVar36._28_4_ = iVar1;
          auVar75 = vfmadd231ps_fma(auVar36,auVar88,ZEXT1632(auVar75));
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar87,ZEXT1632(auVar81));
          fVar162 = auVar80._0_4_;
          fVar171 = auVar80._4_4_;
          fVar172 = auVar80._8_4_;
          fVar173 = auVar80._12_4_;
          auVar101 = ZEXT1632(CONCAT412(auVar75._12_4_ * fVar173,
                                        CONCAT48(auVar75._8_4_ * fVar172,
                                                 CONCAT44(auVar75._4_4_ * fVar171,
                                                          auVar75._0_4_ * fVar162))));
          auVar149 = ZEXT3264(auVar101);
          auVar187._4_4_ = uVar191;
          auVar187._0_4_ = uVar191;
          auVar187._8_4_ = uVar191;
          auVar187._12_4_ = uVar191;
          auVar187._16_4_ = uVar191;
          auVar187._20_4_ = uVar191;
          auVar187._24_4_ = uVar191;
          auVar187._28_4_ = uVar191;
          uVar141 = vcmpps_avx512vl(auVar187,auVar101,2);
          uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar27._4_4_ = uVar133;
          auVar27._0_4_ = uVar133;
          auVar27._8_4_ = uVar133;
          auVar27._12_4_ = uVar133;
          auVar27._16_4_ = uVar133;
          auVar27._20_4_ = uVar133;
          auVar27._24_4_ = uVar133;
          auVar27._28_4_ = uVar133;
          uVar23 = vcmpps_avx512vl(auVar101,auVar27,2);
          local_450 = (byte)uVar141 & (byte)uVar23 & local_450;
          if (local_450 == 0) {
            local_450 = 0;
            auVar183 = ZEXT3264(auVar113);
            auVar149 = ZEXT3264(auVar148);
          }
          else {
            uVar141 = vcmpps_avx512vl(auVar99,auVar93,4);
            if ((local_450 & (byte)uVar141) == 0) {
              local_450 = 0;
              auVar183 = ZEXT3264(auVar113);
              auVar149 = ZEXT3264(auVar148);
            }
            else {
              local_450 = local_450 & (byte)uVar141;
              fVar150 = auVar89._0_4_ * fVar162;
              fVar161 = auVar89._4_4_ * fVar171;
              auVar148._4_4_ = fVar161;
              auVar148._0_4_ = fVar150;
              fVar73 = auVar89._8_4_ * fVar172;
              auVar148._8_4_ = fVar73;
              fVar74 = auVar89._12_4_ * fVar173;
              auVar148._12_4_ = fVar74;
              fVar124 = auVar89._16_4_ * 0.0;
              auVar148._16_4_ = fVar124;
              fVar125 = auVar89._20_4_ * 0.0;
              auVar148._20_4_ = fVar125;
              fVar126 = auVar89._24_4_ * 0.0;
              auVar148._24_4_ = fVar126;
              auVar148._28_4_ = auVar89._28_4_;
              fVar162 = auVar90._0_4_ * fVar162;
              fVar171 = auVar90._4_4_ * fVar171;
              auVar113._4_4_ = fVar171;
              auVar113._0_4_ = fVar162;
              fVar172 = auVar90._8_4_ * fVar172;
              auVar113._8_4_ = fVar172;
              fVar173 = auVar90._12_4_ * fVar173;
              auVar113._12_4_ = fVar173;
              fVar127 = auVar90._16_4_ * 0.0;
              auVar113._16_4_ = fVar127;
              fVar129 = auVar90._20_4_ * 0.0;
              auVar113._20_4_ = fVar129;
              fVar130 = auVar90._24_4_ * 0.0;
              auVar113._24_4_ = fVar130;
              auVar113._28_4_ = auVar90._28_4_;
              auVar177._8_4_ = 0x3f800000;
              auVar177._0_8_ = &DAT_3f8000003f800000;
              auVar177._12_4_ = 0x3f800000;
              auVar177._16_4_ = 0x3f800000;
              auVar177._20_4_ = 0x3f800000;
              auVar177._24_4_ = 0x3f800000;
              auVar177._28_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar177,auVar148);
              bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar18 = SUB81(uVar65 >> 7,0);
              auVar183 = ZEXT3264(CONCAT428((uint)bVar18 * auVar89._28_4_ |
                                            (uint)!bVar18 * auVar99._28_4_,
                                            CONCAT424((uint)bVar16 * (int)fVar126 |
                                                      (uint)!bVar16 * auVar99._24_4_,
                                                      CONCAT420((uint)bVar15 * (int)fVar125 |
                                                                (uint)!bVar15 * auVar99._20_4_,
                                                                CONCAT416((uint)bVar14 *
                                                                          (int)fVar124 |
                                                                          (uint)!bVar14 *
                                                                          auVar99._16_4_,
                                                                          CONCAT412((uint)bVar13 *
                                                                                    (int)fVar74 |
                                                                                    (uint)!bVar13 *
                                                                                    auVar99._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar12 * (int)fVar73 |
                                                  (uint)!bVar12 * auVar99._8_4_,
                                                  CONCAT44((uint)bVar68 * (int)fVar161 |
                                                           (uint)!bVar68 * auVar99._4_4_,
                                                           (uint)(bVar67 & 1) * (int)fVar150 |
                                                           (uint)!(bool)(bVar67 & 1) * auVar99._0_4_
                                                          ))))))));
              auVar99 = vsubps_avx(auVar177,auVar113);
              bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar65 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar65 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar65 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar65 >> 6) & 1);
              bVar18 = SUB81(uVar65 >> 7,0);
              local_380._4_4_ = (uint)bVar68 * (int)fVar171 | (uint)!bVar68 * auVar99._4_4_;
              local_380._0_4_ =
                   (uint)(bVar67 & 1) * (int)fVar162 | (uint)!(bool)(bVar67 & 1) * auVar99._0_4_;
              local_380._8_4_ = (uint)bVar12 * (int)fVar172 | (uint)!bVar12 * auVar99._8_4_;
              local_380._12_4_ = (uint)bVar13 * (int)fVar173 | (uint)!bVar13 * auVar99._12_4_;
              local_380._16_4_ = (uint)bVar14 * (int)fVar127 | (uint)!bVar14 * auVar99._16_4_;
              local_380._20_4_ = (uint)bVar15 * (int)fVar129 | (uint)!bVar15 * auVar99._20_4_;
              local_380._24_4_ = (uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar99._24_4_;
              local_380._28_4_ = (uint)bVar18 * auVar90._28_4_ | (uint)!bVar18 * auVar99._28_4_;
            }
          }
        }
        auVar201 = ZEXT3264(local_600);
        if (local_450 != 0) {
          auVar99 = vsubps_avx(ZEXT1632(auVar76),auVar96);
          auVar113 = auVar183._0_32_;
          auVar80 = vfmadd213ps_fma(auVar99,auVar113,auVar96);
          uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar96._4_4_ = uVar133;
          auVar96._0_4_ = uVar133;
          auVar96._8_4_ = uVar133;
          auVar96._12_4_ = uVar133;
          auVar96._16_4_ = uVar133;
          auVar96._20_4_ = uVar133;
          auVar96._24_4_ = uVar133;
          auVar96._28_4_ = uVar133;
          auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                       CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                CONCAT44(auVar80._4_4_ +
                                                                         auVar80._4_4_,
                                                                         auVar80._0_4_ +
                                                                         auVar80._0_4_)))),auVar96);
          auVar148 = auVar149._0_32_;
          uVar141 = vcmpps_avx512vl(auVar148,auVar99,6);
          local_450 = local_450 & (byte)uVar141;
          if (local_450 != 0) {
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_4e0 = vfmadd132ps_avx512vl(local_380,auVar138,auVar28);
            local_380 = local_4e0;
            auVar99 = local_380;
            local_4a0 = 0;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar68 = true, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar162 = 1.0 / auVar95._0_4_;
                local_440[0] = fVar162 * (auVar183._0_4_ + 0.0);
                local_440[1] = fVar162 * (auVar183._4_4_ + 1.0);
                local_440[2] = fVar162 * (auVar183._8_4_ + 2.0);
                local_440[3] = fVar162 * (auVar183._12_4_ + 3.0);
                fStack_430 = fVar162 * (auVar183._16_4_ + 4.0);
                fStack_42c = fVar162 * (auVar183._20_4_ + 5.0);
                fStack_428 = fVar162 * (auVar183._24_4_ + 6.0);
                fStack_424 = auVar183._28_4_ + 7.0;
                local_380._0_8_ = local_4e0._0_8_;
                local_380._8_8_ = local_4e0._8_8_;
                local_380._16_8_ = local_4e0._16_8_;
                local_380._24_8_ = local_4e0._24_8_;
                local_420 = local_380._0_8_;
                uStack_418 = local_380._8_8_;
                uStack_410 = local_380._16_8_;
                uStack_408 = local_380._24_8_;
                local_400 = auVar148;
                lVar71 = 0;
                uVar69 = (ulong)local_450;
                for (uVar65 = uVar69; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000)
                {
                  lVar71 = lVar71 + 1;
                }
                _local_3e0 = vpbroadcastd_avx512vl();
                local_580 = vpbroadcastd_avx512vl();
                local_6e0 = (undefined4)local_6c0;
                uStack_6dc = (undefined4)((ulong)local_6c0 >> 0x20);
                bVar68 = true;
                local_6f0 = local_640;
                uStack_6e8 = uStack_638;
                uStack_6d8 = uStack_6b8;
                uStack_6c8 = uStack_6a8;
                local_500 = auVar113;
                local_4c0 = auVar148;
                local_49c = iVar9;
                local_490 = auVar82;
                local_480 = local_6d0;
                uStack_478 = uStack_6a8;
                local_470 = local_6c0;
                uStack_468 = uStack_6b8;
                local_460 = local_640;
                uStack_458 = uStack_638;
                local_380 = auVar99;
                do {
                  auVar76 = auVar203._0_16_;
                  local_540 = (float)uVar69;
                  fStack_53c = (float)(uVar69 >> 0x20);
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar162 = local_440[lVar71];
                  auVar144._4_4_ = fVar162;
                  auVar144._0_4_ = fVar162;
                  auVar144._8_4_ = fVar162;
                  auVar144._12_4_ = fVar162;
                  local_280._16_4_ = fVar162;
                  local_280._0_16_ = auVar144;
                  local_280._20_4_ = fVar162;
                  local_280._24_4_ = fVar162;
                  local_280._28_4_ = fVar162;
                  local_3c0 = (uint)lVar71;
                  uStack_3bc = (uint)((ulong)lVar71 >> 0x20);
                  local_260 = *(undefined4 *)((long)&local_420 + lVar71 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + lVar71 * 4);
                  local_730.context = context->user;
                  fVar171 = 1.0 - fVar162;
                  auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar162 * (fVar171 + fVar171))),
                                             ZEXT416((uint)fVar171),ZEXT416((uint)fVar171));
                  auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar144,
                                            ZEXT416(0xc0a00000));
                  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162 * 3.0)),
                                            ZEXT416((uint)(fVar162 + fVar162)),auVar80);
                  auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar144,
                                            ZEXT416(0x40000000));
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * -3.0)),
                                            ZEXT416((uint)(fVar171 + fVar171)),auVar80);
                  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),auVar144,
                                            ZEXT416((uint)(fVar171 * -2.0)));
                  fVar162 = auVar20._0_4_ * 0.5;
                  fVar171 = auVar75._0_4_ * 0.5;
                  fVar172 = auVar80._0_4_ * 0.5;
                  fVar173 = auVar81._0_4_ * 0.5;
                  auVar156._0_4_ = fVar173 * (float)local_6f0;
                  auVar156._4_4_ = fVar173 * local_6f0._4_4_;
                  auVar156._8_4_ = fVar173 * (float)uStack_6e8;
                  auVar156._12_4_ = fVar173 * uStack_6e8._4_4_;
                  auVar175._4_4_ = fVar172;
                  auVar175._0_4_ = fVar172;
                  auVar175._8_4_ = fVar172;
                  auVar175._12_4_ = fVar172;
                  auVar56._4_4_ = uStack_6dc;
                  auVar56._0_4_ = local_6e0;
                  auVar56._8_8_ = uStack_6d8;
                  auVar80 = vfmadd132ps_fma(auVar175,auVar156,auVar56);
                  auVar157._4_4_ = fVar171;
                  auVar157._0_4_ = fVar171;
                  auVar157._8_4_ = fVar171;
                  auVar157._12_4_ = fVar171;
                  auVar57._8_8_ = uStack_6c8;
                  auVar57._0_8_ = local_6d0;
                  auVar80 = vfmadd132ps_fma(auVar157,auVar80,auVar57);
                  auVar136._4_4_ = fVar162;
                  auVar136._0_4_ = fVar162;
                  auVar136._8_4_ = fVar162;
                  auVar136._12_4_ = fVar162;
                  auVar80 = vfmadd213ps_fma(auVar136,auVar82,auVar80);
                  local_2e0 = auVar80._0_4_;
                  auVar167._8_4_ = 1;
                  auVar167._0_8_ = 0x100000001;
                  auVar167._12_4_ = 1;
                  auVar167._16_4_ = 1;
                  auVar167._20_4_ = 1;
                  auVar167._24_4_ = 1;
                  auVar167._28_4_ = 1;
                  local_2c0 = vpermps_avx2(auVar167,ZEXT1632(auVar80));
                  auVar178._8_4_ = 2;
                  auVar178._0_8_ = 0x200000002;
                  auVar178._12_4_ = 2;
                  auVar178._16_4_ = 2;
                  auVar178._20_4_ = 2;
                  auVar178._24_4_ = 2;
                  auVar178._28_4_ = 2;
                  local_2a0 = vpermps_avx2(auVar178,ZEXT1632(auVar80));
                  uStack_2dc = local_2e0;
                  uStack_2d8 = local_2e0;
                  uStack_2d4 = local_2e0;
                  uStack_2d0 = local_2e0;
                  uStack_2cc = local_2e0;
                  uStack_2c8 = local_2e0;
                  uStack_2c4 = local_2e0;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  local_240 = local_580._0_8_;
                  uStack_238 = local_580._8_8_;
                  uStack_230 = local_580._16_8_;
                  uStack_228 = local_580._24_8_;
                  local_220 = _local_3e0;
                  vpcmpeqd_avx2(_local_3e0,_local_3e0);
                  local_200 = (local_730.context)->instID[0];
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = (local_730.context)->instPrimID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_660 = local_320._0_8_;
                  uStack_658 = local_320._8_8_;
                  uStack_650 = local_320._16_8_;
                  uStack_648 = local_320._24_8_;
                  local_730.valid = (int *)&local_660;
                  local_730.geometryUserPtr = pGVar10->userPtr;
                  local_730.hit = (RTCHitN *)&local_2e0;
                  local_730.N = 8;
                  local_560._0_4_ = uVar133;
                  local_730.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_730);
                    auVar196 = ZEXT1664(local_700);
                    auVar199 = ZEXT3264(local_6a0);
                    auVar200 = ZEXT3264(local_680);
                    auVar202 = ZEXT3264(local_5a0);
                    in_ZMM20 = ZEXT3264(local_5e0);
                    auVar80 = vxorps_avx512vl(auVar76,auVar76);
                    auVar203 = ZEXT1664(auVar80);
                    auVar201 = ZEXT3264(local_600);
                    uVar133 = local_560._0_4_;
                    uVar191 = local_620._0_4_;
                  }
                  auVar80 = auVar203._0_16_;
                  auVar58._8_8_ = uStack_658;
                  auVar58._0_8_ = local_660;
                  auVar58._16_8_ = uStack_650;
                  auVar58._24_8_ = uStack_648;
                  if (auVar58 == (undefined1  [32])0x0) {
                    uVar69 = CONCAT44(fStack_53c,local_540);
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_730);
                      auVar196 = ZEXT1664(local_700);
                      auVar199 = ZEXT3264(local_6a0);
                      auVar200 = ZEXT3264(local_680);
                      auVar202 = ZEXT3264(local_5a0);
                      in_ZMM20 = ZEXT3264(local_5e0);
                      auVar80 = vxorps_avx512vl(auVar80,auVar80);
                      auVar203 = ZEXT1664(auVar80);
                      auVar201 = ZEXT3264(local_600);
                      uVar191 = local_620._0_4_;
                      uVar133 = local_560._0_4_;
                    }
                    auVar59._8_8_ = uStack_658;
                    auVar59._0_8_ = local_660;
                    auVar59._16_8_ = uStack_650;
                    auVar59._24_8_ = uStack_648;
                    uVar65 = vptestmd_avx512vl(auVar59,auVar59);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar65 & 1);
                    bVar13 = (bool)((byte)(uVar65 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar65 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar65 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar65 >> 6) & 1);
                    bVar19 = SUB81(uVar65 >> 7,0);
                    *(uint *)(local_730.ray + 0x100) =
                         (uint)bVar12 * auVar99._0_4_ |
                         (uint)!bVar12 * *(int *)(local_730.ray + 0x100);
                    *(uint *)(local_730.ray + 0x104) =
                         (uint)bVar13 * auVar99._4_4_ |
                         (uint)!bVar13 * *(int *)(local_730.ray + 0x104);
                    *(uint *)(local_730.ray + 0x108) =
                         (uint)bVar14 * auVar99._8_4_ |
                         (uint)!bVar14 * *(int *)(local_730.ray + 0x108);
                    *(uint *)(local_730.ray + 0x10c) =
                         (uint)bVar15 * auVar99._12_4_ |
                         (uint)!bVar15 * *(int *)(local_730.ray + 0x10c);
                    *(uint *)(local_730.ray + 0x110) =
                         (uint)bVar16 * auVar99._16_4_ |
                         (uint)!bVar16 * *(int *)(local_730.ray + 0x110);
                    *(uint *)(local_730.ray + 0x114) =
                         (uint)bVar18 * auVar99._20_4_ |
                         (uint)!bVar18 * *(int *)(local_730.ray + 0x114);
                    *(uint *)(local_730.ray + 0x118) =
                         (uint)bVar17 * auVar99._24_4_ |
                         (uint)!bVar17 * *(int *)(local_730.ray + 0x118);
                    *(uint *)(local_730.ray + 0x11c) =
                         (uint)bVar19 * auVar99._28_4_ |
                         (uint)!bVar19 * *(int *)(local_730.ray + 0x11c);
                    uVar69 = CONCAT44(fStack_53c,local_540);
                    local_540 = auVar196._0_4_;
                    if (auVar59 != (undefined1  [32])0x0) break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar133;
                  lVar71 = 0;
                  uVar69 = uVar69 ^ 1L << ((ulong)local_3c0 & 0x3f);
                  for (uVar65 = uVar69; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000
                      ) {
                    lVar71 = lVar71 + 1;
                  }
                  bVar68 = uVar69 != 0;
                  local_540 = auVar196._0_4_;
                } while (bVar68);
                auVar183 = ZEXT3264(auVar113);
                auVar149 = ZEXT3264(auVar148);
              }
              goto LAB_01b69634;
            }
          }
        }
        bVar68 = false;
      }
LAB_01b69634:
      local_600 = auVar201._0_32_;
      if (8 < iVar9) {
        local_620 = vpbroadcastd_avx512vl();
        local_3c0 = uVar191;
        uStack_3bc = uVar191;
        uStack_3b8 = uVar191;
        uStack_3b4 = uVar191;
        uStack_3b0 = uVar191;
        uStack_3ac = uVar191;
        uStack_3a8 = uVar191;
        uStack_3a4 = uVar191;
        local_3e0._4_4_ = 1.0 / (float)local_520._0_4_;
        local_3e0._0_4_ = local_3e0._4_4_;
        fStack_3d8 = (float)local_3e0._4_4_;
        fStack_3d4 = (float)local_3e0._4_4_;
        fStack_3d0 = (float)local_3e0._4_4_;
        fStack_3cc = (float)local_3e0._4_4_;
        fStack_3c8 = (float)local_3e0._4_4_;
        fStack_3c4 = (float)local_3e0._4_4_;
        local_520 = vpbroadcastd_avx512vl();
        local_560 = vpbroadcastd_avx512vl();
        lVar71 = 8;
        auVar148 = auVar183._0_32_;
        auVar99 = auVar149._0_32_;
        fStack_53c = local_540;
        fStack_538 = local_540;
        fStack_534 = local_540;
        fStack_530 = local_540;
        fStack_52c = local_540;
        fStack_528 = local_540;
        fStack_524 = local_540;
        do {
          auVar113 = vpbroadcastd_avx512vl();
          auVar100 = vpor_avx2(auVar113,_DAT_0205a920);
          uVar23 = vpcmpd_avx512vl(auVar100,local_620,1);
          auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar71 * 4 + lVar24);
          auVar101 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar71 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar71 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar24 + 0x22310f8 + lVar71 * 4);
          auVar86 = vmulps_avx512vl(local_120,auVar102);
          auVar87 = vmulps_avx512vl(local_140,auVar102);
          auVar37._4_4_ = auVar102._4_4_ * (float)local_160._4_4_;
          auVar37._0_4_ = auVar102._0_4_ * (float)local_160._0_4_;
          auVar37._8_4_ = auVar102._8_4_ * fStack_158;
          auVar37._12_4_ = auVar102._12_4_ * fStack_154;
          auVar37._16_4_ = auVar102._16_4_ * fStack_150;
          auVar37._20_4_ = auVar102._20_4_ * fStack_14c;
          auVar37._24_4_ = auVar102._24_4_ * fStack_148;
          auVar37._28_4_ = auVar100._28_4_;
          auVar100 = vfmadd231ps_avx512vl(auVar86,auVar104,local_c0);
          auVar86 = vfmadd231ps_avx512vl(auVar87,auVar104,local_e0);
          auVar87 = vfmadd231ps_avx512vl(auVar37,auVar104,local_100);
          auVar97 = auVar199._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar97);
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar101,local_300);
          auVar80 = vfmadd231ps_fma(auVar87,auVar101,local_a0);
          auVar105 = auVar202._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar100,auVar113,auVar105);
          auVar98 = auVar200._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar86,auVar113,auVar98);
          auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar71 * 4 + lVar24);
          auVar86 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar71 * 4);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar113,local_80);
          auVar87 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar71 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar24 + 0x2233518 + lVar71 * 4);
          auVar103 = vmulps_avx512vl(local_120,auVar88);
          auVar89 = vmulps_avx512vl(local_140,auVar88);
          auVar38._4_4_ = auVar88._4_4_ * (float)local_160._4_4_;
          auVar38._0_4_ = auVar88._0_4_ * (float)local_160._0_4_;
          auVar38._8_4_ = auVar88._8_4_ * fStack_158;
          auVar38._12_4_ = auVar88._12_4_ * fStack_154;
          auVar38._16_4_ = auVar88._16_4_ * fStack_150;
          auVar38._20_4_ = auVar88._20_4_ * fStack_14c;
          auVar38._24_4_ = auVar88._24_4_ * fStack_148;
          auVar38._28_4_ = uStack_144;
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar87,local_c0);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,local_e0);
          auVar92 = vfmadd231ps_avx512vl(auVar38,auVar87,local_100);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar86,auVar97);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_300);
          auVar75 = vfmadd231ps_fma(auVar92,auVar86,local_a0);
          auVar92 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar105);
          auVar93 = vfmadd231ps_avx512vl(auVar89,auVar100,auVar98);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar100,local_80);
          auVar94 = vmaxps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar75));
          auVar103 = vsubps_avx(auVar92,auVar90);
          auVar89 = vsubps_avx(auVar93,auVar91);
          auVar95 = vmulps_avx512vl(auVar91,auVar103);
          auVar96 = vmulps_avx512vl(auVar90,auVar89);
          auVar95 = vsubps_avx512vl(auVar95,auVar96);
          auVar96 = vmulps_avx512vl(auVar89,auVar89);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar103);
          auVar94 = vmulps_avx512vl(auVar94,auVar94);
          auVar94 = vmulps_avx512vl(auVar94,auVar96);
          auVar95 = vmulps_avx512vl(auVar95,auVar95);
          uVar141 = vcmpps_avx512vl(auVar95,auVar94,2);
          local_450 = (byte)uVar23 & (byte)uVar141;
          if (local_450 == 0) {
            auVar200 = ZEXT3264(auVar98);
            auVar199 = ZEXT3264(auVar97);
          }
          else {
            auVar88 = vmulps_avx512vl(local_5c0,auVar88);
            auVar87 = vfmadd213ps_avx512vl(auVar87,local_1c0,auVar88);
            auVar86 = vfmadd213ps_avx512vl(auVar86,local_1a0,auVar87);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_180,auVar86);
            auVar102 = vmulps_avx512vl(local_5c0,auVar102);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_1c0,auVar102);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_1a0,auVar104);
            auVar86 = vfmadd213ps_avx512vl(auVar113,local_180,auVar101);
            auVar113 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar71 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar71 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar71 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar24 + 0x2232308 + lVar71 * 4);
            auVar87 = vmulps_avx512vl(local_120,auVar102);
            auVar88 = vmulps_avx512vl(local_140,auVar102);
            auVar102 = vmulps_avx512vl(local_5c0,auVar102);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,local_c0);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar104,local_e0);
            auVar104 = vfmadd231ps_avx512vl(auVar102,local_1c0,auVar104);
            auVar102 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar97);
            auVar87 = vfmadd231ps_avx512vl(auVar88,auVar101,local_300);
            auVar101 = vfmadd231ps_avx512vl(auVar104,local_1a0,auVar101);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar113,auVar105);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar113,auVar98);
            auVar88 = vfmadd231ps_avx512vl(auVar101,local_180,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar71 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar71 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar24 + 0x2234728 + lVar71 * 4);
            auVar94 = vmulps_avx512vl(local_120,auVar104);
            auVar95 = vmulps_avx512vl(local_140,auVar104);
            auVar104 = vmulps_avx512vl(local_5c0,auVar104);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_c0);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_e0);
            auVar104 = vfmadd231ps_avx512vl(auVar104,local_1c0,auVar101);
            auVar101 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar71 * 4);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar97);
            auVar81 = vfmadd231ps_fma(auVar95,auVar101,local_300);
            auVar101 = vfmadd231ps_avx512vl(auVar104,local_1a0,auVar101);
            auVar104 = vfmadd231ps_avx512vl(auVar94,auVar113,auVar105);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar113,auVar98);
            auVar101 = vfmadd231ps_avx512vl(auVar101,local_180,auVar113);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar102,auVar95);
            vandps_avx512vl(auVar87,auVar95);
            auVar113 = vmaxps_avx(auVar95,auVar95);
            vandps_avx512vl(auVar88,auVar95);
            auVar113 = vmaxps_avx(auVar113,auVar95);
            auVar62._4_4_ = fStack_53c;
            auVar62._0_4_ = local_540;
            auVar62._8_4_ = fStack_538;
            auVar62._12_4_ = fStack_534;
            auVar62._16_4_ = fStack_530;
            auVar62._20_4_ = fStack_52c;
            auVar62._24_4_ = fStack_528;
            auVar62._28_4_ = fStack_524;
            uVar65 = vcmpps_avx512vl(auVar113,auVar62,1);
            bVar12 = (bool)((byte)uVar65 & 1);
            auVar114._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar102._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar102._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar102._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar102._12_4_);
            bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar102._16_4_);
            bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar102._20_4_);
            bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar102._24_4_);
            bVar12 = SUB81(uVar65 >> 7,0);
            auVar114._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar102._28_4_;
            bVar12 = (bool)((byte)uVar65 & 1);
            auVar115._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar87._0_4_);
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar87._4_4_);
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar87._8_4_);
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar87._12_4_);
            bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar115._16_4_ =
                 (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar87._16_4_);
            bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar115._20_4_ =
                 (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar87._20_4_);
            bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar115._24_4_ =
                 (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar87._24_4_);
            bVar12 = SUB81(uVar65 >> 7,0);
            auVar115._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar87._28_4_;
            vandps_avx512vl(auVar104,auVar95);
            vandps_avx512vl(auVar94,auVar95);
            auVar113 = vmaxps_avx(auVar115,auVar115);
            vandps_avx512vl(auVar101,auVar95);
            auVar113 = vmaxps_avx(auVar113,auVar115);
            uVar65 = vcmpps_avx512vl(auVar113,auVar62,1);
            bVar12 = (bool)((byte)uVar65 & 1);
            auVar116._0_4_ = (uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar104._0_4_;
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar104._4_4_;
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar104._8_4_;
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar104._12_4_;
            bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar116._16_4_ = (uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar104._16_4_;
            bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar116._20_4_ = (uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar104._20_4_;
            bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar116._24_4_ = (uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar104._24_4_;
            bVar12 = SUB81(uVar65 >> 7,0);
            auVar116._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar104._28_4_;
            bVar12 = (bool)((byte)uVar65 & 1);
            auVar117._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar94._0_4_);
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar94._4_4_);
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar94._8_4_);
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar94._12_4_);
            bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar94._16_4_);
            bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar94._20_4_);
            bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar94._24_4_);
            bVar12 = SUB81(uVar65 >> 7,0);
            auVar117._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar94._28_4_;
            auVar190._8_4_ = 0x80000000;
            auVar190._0_8_ = 0x8000000080000000;
            auVar190._12_4_ = 0x80000000;
            auVar190._16_4_ = 0x80000000;
            auVar190._20_4_ = 0x80000000;
            auVar190._24_4_ = 0x80000000;
            auVar190._28_4_ = 0x80000000;
            auVar113 = vxorps_avx512vl(auVar116,auVar190);
            auVar94 = auVar203._0_32_;
            auVar101 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar94);
            auVar81 = vfmadd231ps_fma(auVar101,auVar115,auVar115);
            auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
            auVar198._8_4_ = 0xbf000000;
            auVar198._0_8_ = 0xbf000000bf000000;
            auVar198._12_4_ = 0xbf000000;
            auVar198._16_4_ = 0xbf000000;
            auVar198._20_4_ = 0xbf000000;
            auVar198._24_4_ = 0xbf000000;
            auVar198._28_4_ = 0xbf000000;
            fVar162 = auVar101._0_4_;
            fVar171 = auVar101._4_4_;
            fVar172 = auVar101._8_4_;
            fVar173 = auVar101._12_4_;
            fVar150 = auVar101._16_4_;
            fVar161 = auVar101._20_4_;
            fVar73 = auVar101._24_4_;
            auVar39._4_4_ = fVar171 * fVar171 * fVar171 * auVar81._4_4_ * -0.5;
            auVar39._0_4_ = fVar162 * fVar162 * fVar162 * auVar81._0_4_ * -0.5;
            auVar39._8_4_ = fVar172 * fVar172 * fVar172 * auVar81._8_4_ * -0.5;
            auVar39._12_4_ = fVar173 * fVar173 * fVar173 * auVar81._12_4_ * -0.5;
            auVar39._16_4_ = fVar150 * fVar150 * fVar150 * -0.0;
            auVar39._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar39._24_4_ = fVar73 * fVar73 * fVar73 * -0.0;
            auVar39._28_4_ = auVar115._28_4_;
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar101 = vfmadd231ps_avx512vl(auVar39,auVar104,auVar101);
            auVar40._4_4_ = auVar115._4_4_ * auVar101._4_4_;
            auVar40._0_4_ = auVar115._0_4_ * auVar101._0_4_;
            auVar40._8_4_ = auVar115._8_4_ * auVar101._8_4_;
            auVar40._12_4_ = auVar115._12_4_ * auVar101._12_4_;
            auVar40._16_4_ = auVar115._16_4_ * auVar101._16_4_;
            auVar40._20_4_ = auVar115._20_4_ * auVar101._20_4_;
            auVar40._24_4_ = auVar115._24_4_ * auVar101._24_4_;
            auVar40._28_4_ = 0;
            auVar41._4_4_ = auVar101._4_4_ * -auVar114._4_4_;
            auVar41._0_4_ = auVar101._0_4_ * -auVar114._0_4_;
            auVar41._8_4_ = auVar101._8_4_ * -auVar114._8_4_;
            auVar41._12_4_ = auVar101._12_4_ * -auVar114._12_4_;
            auVar41._16_4_ = auVar101._16_4_ * -auVar114._16_4_;
            auVar41._20_4_ = auVar101._20_4_ * -auVar114._20_4_;
            auVar41._24_4_ = auVar101._24_4_ * -auVar114._24_4_;
            auVar41._28_4_ = auVar115._28_4_;
            auVar102 = vmulps_avx512vl(auVar101,auVar94);
            auVar101 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar94);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar117,auVar117);
            auVar87 = vrsqrt14ps_avx512vl(auVar101);
            auVar101 = vmulps_avx512vl(auVar101,auVar198);
            fVar162 = auVar87._0_4_;
            fVar171 = auVar87._4_4_;
            fVar172 = auVar87._8_4_;
            fVar173 = auVar87._12_4_;
            fVar150 = auVar87._16_4_;
            fVar161 = auVar87._20_4_;
            fVar73 = auVar87._24_4_;
            auVar42._4_4_ = fVar171 * fVar171 * fVar171 * auVar101._4_4_;
            auVar42._0_4_ = fVar162 * fVar162 * fVar162 * auVar101._0_4_;
            auVar42._8_4_ = fVar172 * fVar172 * fVar172 * auVar101._8_4_;
            auVar42._12_4_ = fVar173 * fVar173 * fVar173 * auVar101._12_4_;
            auVar42._16_4_ = fVar150 * fVar150 * fVar150 * auVar101._16_4_;
            auVar42._20_4_ = fVar161 * fVar161 * fVar161 * auVar101._20_4_;
            auVar42._24_4_ = fVar73 * fVar73 * fVar73 * auVar101._24_4_;
            auVar42._28_4_ = auVar101._28_4_;
            auVar101 = vfmadd231ps_avx512vl(auVar42,auVar104,auVar87);
            auVar43._4_4_ = auVar117._4_4_ * auVar101._4_4_;
            auVar43._0_4_ = auVar117._0_4_ * auVar101._0_4_;
            auVar43._8_4_ = auVar117._8_4_ * auVar101._8_4_;
            auVar43._12_4_ = auVar117._12_4_ * auVar101._12_4_;
            auVar43._16_4_ = auVar117._16_4_ * auVar101._16_4_;
            auVar43._20_4_ = auVar117._20_4_ * auVar101._20_4_;
            auVar43._24_4_ = auVar117._24_4_ * auVar101._24_4_;
            auVar43._28_4_ = auVar87._28_4_;
            auVar44._4_4_ = auVar101._4_4_ * auVar113._4_4_;
            auVar44._0_4_ = auVar101._0_4_ * auVar113._0_4_;
            auVar44._8_4_ = auVar101._8_4_ * auVar113._8_4_;
            auVar44._12_4_ = auVar101._12_4_ * auVar113._12_4_;
            auVar44._16_4_ = auVar101._16_4_ * auVar113._16_4_;
            auVar44._20_4_ = auVar101._20_4_ * auVar113._20_4_;
            auVar44._24_4_ = auVar101._24_4_ * auVar113._24_4_;
            auVar44._28_4_ = auVar113._28_4_;
            auVar113 = vmulps_avx512vl(auVar101,auVar94);
            auVar81 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar80),auVar90);
            auVar101 = ZEXT1632(auVar80);
            auVar20 = vfmadd213ps_fma(auVar41,auVar101,auVar91);
            auVar104 = vfmadd213ps_avx512vl(auVar102,auVar101,auVar86);
            auVar87 = vfmadd213ps_avx512vl(auVar43,ZEXT1632(auVar75),auVar92);
            auVar22 = vfnmadd213ps_fma(auVar40,auVar101,auVar90);
            auVar88 = ZEXT1632(auVar75);
            auVar76 = vfmadd213ps_fma(auVar44,auVar88,auVar93);
            auVar84 = vfnmadd213ps_fma(auVar41,auVar101,auVar91);
            auVar83 = vfmadd213ps_fma(auVar113,auVar88,auVar100);
            auVar91 = ZEXT1632(auVar80);
            auVar85 = vfnmadd231ps_fma(auVar86,auVar91,auVar102);
            auVar79 = vfnmadd213ps_fma(auVar43,auVar88,auVar92);
            auVar78 = vfnmadd213ps_fma(auVar44,auVar88,auVar93);
            auVar134 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar75),auVar113);
            auVar100 = vsubps_avx512vl(auVar87,ZEXT1632(auVar22));
            auVar113 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar84));
            auVar101 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar85));
            auVar45._4_4_ = auVar113._4_4_ * auVar85._4_4_;
            auVar45._0_4_ = auVar113._0_4_ * auVar85._0_4_;
            auVar45._8_4_ = auVar113._8_4_ * auVar85._8_4_;
            auVar45._12_4_ = auVar113._12_4_ * auVar85._12_4_;
            auVar45._16_4_ = auVar113._16_4_ * 0.0;
            auVar45._20_4_ = auVar113._20_4_ * 0.0;
            auVar45._24_4_ = auVar113._24_4_ * 0.0;
            auVar45._28_4_ = auVar102._28_4_;
            auVar80 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar84),auVar101);
            auVar46._4_4_ = auVar101._4_4_ * auVar22._4_4_;
            auVar46._0_4_ = auVar101._0_4_ * auVar22._0_4_;
            auVar46._8_4_ = auVar101._8_4_ * auVar22._8_4_;
            auVar46._12_4_ = auVar101._12_4_ * auVar22._12_4_;
            auVar46._16_4_ = auVar101._16_4_ * 0.0;
            auVar46._20_4_ = auVar101._20_4_ * 0.0;
            auVar46._24_4_ = auVar101._24_4_ * 0.0;
            auVar46._28_4_ = auVar101._28_4_;
            auVar21 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar85),auVar100);
            auVar47._4_4_ = auVar84._4_4_ * auVar100._4_4_;
            auVar47._0_4_ = auVar84._0_4_ * auVar100._0_4_;
            auVar47._8_4_ = auVar84._8_4_ * auVar100._8_4_;
            auVar47._12_4_ = auVar84._12_4_ * auVar100._12_4_;
            auVar47._16_4_ = auVar100._16_4_ * 0.0;
            auVar47._20_4_ = auVar100._20_4_ * 0.0;
            auVar47._24_4_ = auVar100._24_4_ * 0.0;
            auVar47._28_4_ = auVar100._28_4_;
            auVar77 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar22),auVar113);
            auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar94,ZEXT1632(auVar21));
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar94,ZEXT1632(auVar80));
            uVar65 = vcmpps_avx512vl(auVar113,auVar94,2);
            bVar67 = (byte)uVar65;
            fVar125 = (float)((uint)(bVar67 & 1) * auVar81._0_4_ |
                             (uint)!(bool)(bVar67 & 1) * auVar79._0_4_);
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            fVar127 = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar79._4_4_);
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            fVar130 = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar79._8_4_);
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            fVar131 = (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar79._12_4_);
            auVar88 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar130,CONCAT44(fVar127,fVar125))));
            fVar126 = (float)((uint)(bVar67 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar67 & 1) * auVar78._0_4_);
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            fVar129 = (float)((uint)bVar12 * auVar20._4_4_ | (uint)!bVar12 * auVar78._4_4_);
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            fVar128 = (float)((uint)bVar12 * auVar20._8_4_ | (uint)!bVar12 * auVar78._8_4_);
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            fVar132 = (float)((uint)bVar12 * auVar20._12_4_ | (uint)!bVar12 * auVar78._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar129,fVar126))));
            auVar118._0_4_ =
                 (float)((uint)(bVar67 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar134._0_4_);
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar134._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar134._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar134._12_4_);
            fVar162 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar104._16_4_);
            auVar118._16_4_ = fVar162;
            fVar171 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar104._20_4_);
            auVar118._20_4_ = fVar171;
            fVar172 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar104._24_4_);
            auVar118._24_4_ = fVar172;
            iVar1 = (uint)(byte)(uVar65 >> 7) * auVar104._28_4_;
            auVar118._28_4_ = iVar1;
            auVar113 = vblendmps_avx512vl(ZEXT1632(auVar22),auVar87);
            auVar119._0_4_ =
                 (uint)(bVar67 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar80._0_4_;
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar80._4_4_;
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar80._8_4_;
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar80._12_4_;
            auVar119._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar113._16_4_;
            auVar119._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar113._20_4_;
            auVar119._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar113._24_4_;
            auVar119._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar113._28_4_;
            auVar113 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar76));
            auVar120._0_4_ =
                 (float)((uint)(bVar67 & 1) * auVar113._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar81._0_4_);
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar81._4_4_);
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar81._8_4_);
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar81._12_4_);
            fVar161 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar113._16_4_);
            auVar120._16_4_ = fVar161;
            fVar173 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar113._20_4_);
            auVar120._20_4_ = fVar173;
            fVar150 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar113._24_4_);
            auVar120._24_4_ = fVar150;
            auVar120._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar113._28_4_;
            auVar113 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar83));
            auVar121._0_4_ =
                 (float)((uint)(bVar67 & 1) * auVar113._0_4_ |
                        (uint)!(bool)(bVar67 & 1) * auVar20._0_4_);
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar20._4_4_);
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar20._8_4_);
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar20._12_4_);
            fVar124 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar113._16_4_);
            auVar121._16_4_ = fVar124;
            fVar73 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar113._20_4_);
            auVar121._20_4_ = fVar73;
            fVar74 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar113._24_4_);
            auVar121._24_4_ = fVar74;
            iVar2 = (uint)(byte)(uVar65 >> 7) * auVar113._28_4_;
            auVar121._28_4_ = iVar2;
            auVar122._0_4_ =
                 (uint)(bVar67 & 1) * (int)auVar22._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar87._0_4_
            ;
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar12 * (int)auVar22._4_4_ | (uint)!bVar12 * auVar87._4_4_;
            bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar12 * (int)auVar22._8_4_ | (uint)!bVar12 * auVar87._8_4_;
            bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar12 * (int)auVar22._12_4_ | (uint)!bVar12 * auVar87._12_4_;
            auVar122._16_4_ = (uint)!(bool)((byte)(uVar65 >> 4) & 1) * auVar87._16_4_;
            auVar122._20_4_ = (uint)!(bool)((byte)(uVar65 >> 5) & 1) * auVar87._20_4_;
            auVar122._24_4_ = (uint)!(bool)((byte)(uVar65 >> 6) & 1) * auVar87._24_4_;
            auVar122._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar87._28_4_;
            bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar65 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar65 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar65 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar87 = vsubps_avx512vl(auVar122,auVar88);
            auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar84._12_4_ |
                                                     (uint)!bVar16 * auVar76._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar84._8_4_ |
                                                              (uint)!bVar14 * auVar76._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar84._4_4_ |
                                                                       (uint)!bVar12 * auVar76._4_4_
                                                                       ,(uint)(bVar67 & 1) *
                                                                        (int)auVar84._0_4_ |
                                                                        (uint)!(bool)(bVar67 & 1) *
                                                                        auVar76._0_4_)))),auVar103);
            auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar85._12_4_ |
                                                     (uint)!bVar18 * auVar83._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar85._8_4_ |
                                                              (uint)!bVar15 * auVar83._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar85._4_4_ |
                                                                       (uint)!bVar13 * auVar83._4_4_
                                                                       ,(uint)(bVar67 & 1) *
                                                                        (int)auVar85._0_4_ |
                                                                        (uint)!(bool)(bVar67 & 1) *
                                                                        auVar83._0_4_)))),auVar118);
            auVar102 = vsubps_avx(auVar88,auVar119);
            auVar100 = vsubps_avx(auVar103,auVar120);
            auVar86 = vsubps_avx(auVar118,auVar121);
            auVar48._4_4_ = auVar104._4_4_ * fVar127;
            auVar48._0_4_ = auVar104._0_4_ * fVar125;
            auVar48._8_4_ = auVar104._8_4_ * fVar130;
            auVar48._12_4_ = auVar104._12_4_ * fVar131;
            auVar48._16_4_ = auVar104._16_4_ * 0.0;
            auVar48._20_4_ = auVar104._20_4_ * 0.0;
            auVar48._24_4_ = auVar104._24_4_ * 0.0;
            auVar48._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar48,auVar118,auVar87);
            auVar160._0_4_ = fVar126 * auVar87._0_4_;
            auVar160._4_4_ = fVar129 * auVar87._4_4_;
            auVar160._8_4_ = fVar128 * auVar87._8_4_;
            auVar160._12_4_ = fVar132 * auVar87._12_4_;
            auVar160._16_4_ = auVar87._16_4_ * 0.0;
            auVar160._20_4_ = auVar87._20_4_ * 0.0;
            auVar160._24_4_ = auVar87._24_4_ * 0.0;
            auVar160._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar160,auVar88,auVar101);
            auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar94,ZEXT1632(auVar80));
            auVar168._0_4_ = auVar101._0_4_ * auVar118._0_4_;
            auVar168._4_4_ = auVar101._4_4_ * auVar118._4_4_;
            auVar168._8_4_ = auVar101._8_4_ * auVar118._8_4_;
            auVar168._12_4_ = auVar101._12_4_ * auVar118._12_4_;
            auVar168._16_4_ = auVar101._16_4_ * fVar162;
            auVar168._20_4_ = auVar101._20_4_ * fVar171;
            auVar168._24_4_ = auVar101._24_4_ * fVar172;
            auVar168._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar168,auVar103,auVar104);
            auVar89 = vfmadd231ps_avx512vl(auVar113,auVar94,ZEXT1632(auVar80));
            auVar113 = vmulps_avx512vl(auVar86,auVar119);
            auVar113 = vfmsub231ps_avx512vl(auVar113,auVar102,auVar121);
            auVar49._4_4_ = auVar100._4_4_ * auVar121._4_4_;
            auVar49._0_4_ = auVar100._0_4_ * auVar121._0_4_;
            auVar49._8_4_ = auVar100._8_4_ * auVar121._8_4_;
            auVar49._12_4_ = auVar100._12_4_ * auVar121._12_4_;
            auVar49._16_4_ = auVar100._16_4_ * fVar124;
            auVar49._20_4_ = auVar100._20_4_ * fVar73;
            auVar49._24_4_ = auVar100._24_4_ * fVar74;
            auVar49._28_4_ = iVar2;
            auVar80 = vfmsub231ps_fma(auVar49,auVar120,auVar86);
            auVar169._0_4_ = auVar120._0_4_ * auVar102._0_4_;
            auVar169._4_4_ = auVar120._4_4_ * auVar102._4_4_;
            auVar169._8_4_ = auVar120._8_4_ * auVar102._8_4_;
            auVar169._12_4_ = auVar120._12_4_ * auVar102._12_4_;
            auVar169._16_4_ = fVar161 * auVar102._16_4_;
            auVar169._20_4_ = fVar173 * auVar102._20_4_;
            auVar169._24_4_ = fVar150 * auVar102._24_4_;
            auVar169._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar169,auVar100,auVar119);
            auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar94,auVar113);
            auVar90 = vfmadd231ps_avx512vl(auVar113,auVar94,ZEXT1632(auVar80));
            auVar113 = vmaxps_avx(auVar89,auVar90);
            uVar141 = vcmpps_avx512vl(auVar113,auVar94,2);
            local_450 = local_450 & (byte)uVar141;
            if (local_450 == 0) {
LAB_01b6a291:
              local_450 = 0;
            }
            else {
              auVar50._4_4_ = auVar86._4_4_ * auVar101._4_4_;
              auVar50._0_4_ = auVar86._0_4_ * auVar101._0_4_;
              auVar50._8_4_ = auVar86._8_4_ * auVar101._8_4_;
              auVar50._12_4_ = auVar86._12_4_ * auVar101._12_4_;
              auVar50._16_4_ = auVar86._16_4_ * auVar101._16_4_;
              auVar50._20_4_ = auVar86._20_4_ * auVar101._20_4_;
              auVar50._24_4_ = auVar86._24_4_ * auVar101._24_4_;
              auVar50._28_4_ = auVar113._28_4_;
              auVar20 = vfmsub231ps_fma(auVar50,auVar100,auVar104);
              auVar51._4_4_ = auVar104._4_4_ * auVar102._4_4_;
              auVar51._0_4_ = auVar104._0_4_ * auVar102._0_4_;
              auVar51._8_4_ = auVar104._8_4_ * auVar102._8_4_;
              auVar51._12_4_ = auVar104._12_4_ * auVar102._12_4_;
              auVar51._16_4_ = auVar104._16_4_ * auVar102._16_4_;
              auVar51._20_4_ = auVar104._20_4_ * auVar102._20_4_;
              auVar51._24_4_ = auVar104._24_4_ * auVar102._24_4_;
              auVar51._28_4_ = auVar104._28_4_;
              auVar81 = vfmsub231ps_fma(auVar51,auVar87,auVar86);
              auVar52._4_4_ = auVar100._4_4_ * auVar87._4_4_;
              auVar52._0_4_ = auVar100._0_4_ * auVar87._0_4_;
              auVar52._8_4_ = auVar100._8_4_ * auVar87._8_4_;
              auVar52._12_4_ = auVar100._12_4_ * auVar87._12_4_;
              auVar52._16_4_ = auVar100._16_4_ * auVar87._16_4_;
              auVar52._20_4_ = auVar100._20_4_ * auVar87._20_4_;
              auVar52._24_4_ = auVar100._24_4_ * auVar87._24_4_;
              auVar52._28_4_ = auVar100._28_4_;
              auVar76 = vfmsub231ps_fma(auVar52,auVar102,auVar101);
              auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar76));
              auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar20),auVar94);
              auVar101 = vrcp14ps_avx512vl(auVar113);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = &DAT_3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar29._16_4_ = 0x3f800000;
              auVar29._20_4_ = 0x3f800000;
              auVar29._24_4_ = 0x3f800000;
              auVar29._28_4_ = 0x3f800000;
              auVar104 = vfnmadd213ps_avx512vl(auVar101,auVar113,auVar29);
              auVar80 = vfmadd132ps_fma(auVar104,auVar101,auVar101);
              auVar53._4_4_ = auVar76._4_4_ * auVar118._4_4_;
              auVar53._0_4_ = auVar76._0_4_ * auVar118._0_4_;
              auVar53._8_4_ = auVar76._8_4_ * auVar118._8_4_;
              auVar53._12_4_ = auVar76._12_4_ * auVar118._12_4_;
              auVar53._16_4_ = fVar162 * 0.0;
              auVar53._20_4_ = fVar171 * 0.0;
              auVar53._24_4_ = fVar172 * 0.0;
              auVar53._28_4_ = iVar1;
              auVar81 = vfmadd231ps_fma(auVar53,auVar103,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar88,ZEXT1632(auVar20));
              fVar162 = auVar80._0_4_;
              fVar171 = auVar80._4_4_;
              fVar172 = auVar80._8_4_;
              fVar173 = auVar80._12_4_;
              auVar101 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar173,
                                            CONCAT48(auVar81._8_4_ * fVar172,
                                                     CONCAT44(auVar81._4_4_ * fVar171,
                                                              auVar81._0_4_ * fVar162))));
              auVar63._4_4_ = uStack_3bc;
              auVar63._0_4_ = local_3c0;
              auVar63._8_4_ = uStack_3b8;
              auVar63._12_4_ = uStack_3b4;
              auVar63._16_4_ = uStack_3b0;
              auVar63._20_4_ = uStack_3ac;
              auVar63._24_4_ = uStack_3a8;
              auVar63._28_4_ = uStack_3a4;
              uVar141 = vcmpps_avx512vl(auVar101,auVar63,0xd);
              uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar30._4_4_ = uVar133;
              auVar30._0_4_ = uVar133;
              auVar30._8_4_ = uVar133;
              auVar30._12_4_ = uVar133;
              auVar30._16_4_ = uVar133;
              auVar30._20_4_ = uVar133;
              auVar30._24_4_ = uVar133;
              auVar30._28_4_ = uVar133;
              uVar23 = vcmpps_avx512vl(auVar101,auVar30,2);
              local_450 = (byte)uVar141 & (byte)uVar23 & local_450;
              if (local_450 == 0) goto LAB_01b6a291;
              uVar141 = vcmpps_avx512vl(auVar113,auVar94,4);
              if ((local_450 & (byte)uVar141) == 0) {
                local_450 = 0;
              }
              else {
                local_450 = local_450 & (byte)uVar141;
                fVar150 = auVar89._0_4_ * fVar162;
                fVar161 = auVar89._4_4_ * fVar171;
                auVar54._4_4_ = fVar161;
                auVar54._0_4_ = fVar150;
                fVar73 = auVar89._8_4_ * fVar172;
                auVar54._8_4_ = fVar73;
                fVar74 = auVar89._12_4_ * fVar173;
                auVar54._12_4_ = fVar74;
                fVar124 = auVar89._16_4_ * 0.0;
                auVar54._16_4_ = fVar124;
                fVar125 = auVar89._20_4_ * 0.0;
                auVar54._20_4_ = fVar125;
                fVar126 = auVar89._24_4_ * 0.0;
                auVar54._24_4_ = fVar126;
                auVar54._28_4_ = auVar89._28_4_;
                fVar162 = auVar90._0_4_ * fVar162;
                fVar171 = auVar90._4_4_ * fVar171;
                auVar55._4_4_ = fVar171;
                auVar55._0_4_ = fVar162;
                fVar172 = auVar90._8_4_ * fVar172;
                auVar55._8_4_ = fVar172;
                fVar173 = auVar90._12_4_ * fVar173;
                auVar55._12_4_ = fVar173;
                fVar127 = auVar90._16_4_ * 0.0;
                auVar55._16_4_ = fVar127;
                fVar129 = auVar90._20_4_ * 0.0;
                auVar55._20_4_ = fVar129;
                fVar130 = auVar90._24_4_ * 0.0;
                auVar55._24_4_ = fVar130;
                auVar55._28_4_ = auVar90._28_4_;
                auVar179._8_4_ = 0x3f800000;
                auVar179._0_8_ = &DAT_3f8000003f800000;
                auVar179._12_4_ = 0x3f800000;
                auVar179._16_4_ = 0x3f800000;
                auVar179._20_4_ = 0x3f800000;
                auVar179._24_4_ = 0x3f800000;
                auVar179._28_4_ = 0x3f800000;
                auVar113 = vsubps_avx512vl(auVar179,auVar54);
                bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar65 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar65 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar65 >> 6) & 1);
                bVar17 = SUB81(uVar65 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar17 * auVar89._28_4_ |
                                              (uint)!bVar17 * auVar113._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar126 |
                                                        (uint)!bVar18 * auVar113._24_4_,
                                                        CONCAT420((uint)bVar16 * (int)fVar125 |
                                                                  (uint)!bVar16 * auVar113._20_4_,
                                                                  CONCAT416((uint)bVar15 *
                                                                            (int)fVar124 |
                                                                            (uint)!bVar15 *
                                                                            auVar113._16_4_,
                                                                            CONCAT412((uint)bVar14 *
                                                                                      (int)fVar74 |
                                                                                      (uint)!bVar14
                                                                                      * auVar113.
                                                  _12_4_,CONCAT48((uint)bVar13 * (int)fVar73 |
                                                                  (uint)!bVar13 * auVar113._8_4_,
                                                                  CONCAT44((uint)bVar12 *
                                                                           (int)fVar161 |
                                                                           (uint)!bVar12 *
                                                                           auVar113._4_4_,
                                                                           (uint)(bVar67 & 1) *
                                                                           (int)fVar150 |
                                                                           (uint)!(bool)(bVar67 & 1)
                                                                           * auVar113._0_4_))))))));
                auVar113 = vsubps_avx(auVar179,auVar55);
                bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar65 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar65 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar65 >> 6) & 1);
                bVar17 = SUB81(uVar65 >> 7,0);
                local_3a0._4_4_ = (uint)bVar12 * (int)fVar171 | (uint)!bVar12 * auVar113._4_4_;
                local_3a0._0_4_ =
                     (uint)(bVar67 & 1) * (int)fVar162 | (uint)!(bool)(bVar67 & 1) * auVar113._0_4_;
                local_3a0._8_4_ = (uint)bVar13 * (int)fVar172 | (uint)!bVar13 * auVar113._8_4_;
                local_3a0._12_4_ = (uint)bVar14 * (int)fVar173 | (uint)!bVar14 * auVar113._12_4_;
                local_3a0._16_4_ = (uint)bVar15 * (int)fVar127 | (uint)!bVar15 * auVar113._16_4_;
                local_3a0._20_4_ = (uint)bVar16 * (int)fVar129 | (uint)!bVar16 * auVar113._20_4_;
                local_3a0._24_4_ = (uint)bVar18 * (int)fVar130 | (uint)!bVar18 * auVar113._24_4_;
                local_3a0._28_4_ = (uint)bVar17 * auVar90._28_4_ | (uint)!bVar17 * auVar113._28_4_;
                auVar201 = ZEXT3264(auVar101);
              }
            }
            auVar200 = ZEXT3264(local_680);
            auVar199 = ZEXT3264(local_6a0);
            if (local_450 != 0) {
              auVar113 = vsubps_avx(ZEXT1632(auVar75),auVar91);
              local_5e0 = in_ZMM20._0_32_;
              auVar113 = vfmadd213ps_avx512vl(auVar113,local_5e0,auVar91);
              auVar139._0_4_ = auVar113._0_4_ + auVar113._0_4_;
              auVar139._4_4_ = auVar113._4_4_ + auVar113._4_4_;
              auVar139._8_4_ = auVar113._8_4_ + auVar113._8_4_;
              auVar139._12_4_ = auVar113._12_4_ + auVar113._12_4_;
              auVar139._16_4_ = auVar113._16_4_ + auVar113._16_4_;
              auVar139._20_4_ = auVar113._20_4_ + auVar113._20_4_;
              auVar139._24_4_ = auVar113._24_4_ + auVar113._24_4_;
              auVar139._28_4_ = auVar113._28_4_ + auVar113._28_4_;
              uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar31._4_4_ = uVar133;
              auVar31._0_4_ = uVar133;
              auVar31._8_4_ = uVar133;
              auVar31._12_4_ = uVar133;
              auVar31._16_4_ = uVar133;
              auVar31._20_4_ = uVar133;
              auVar31._24_4_ = uVar133;
              auVar31._28_4_ = uVar133;
              auVar113 = vmulps_avx512vl(auVar139,auVar31);
              local_600 = auVar201._0_32_;
              uVar141 = vcmpps_avx512vl(local_600,auVar113,6);
              local_450 = local_450 & (byte)uVar141;
              if (local_450 != 0) {
                auVar140._8_4_ = 0xbf800000;
                auVar140._0_8_ = 0xbf800000bf800000;
                auVar140._12_4_ = 0xbf800000;
                auVar140._16_4_ = 0xbf800000;
                auVar140._20_4_ = 0xbf800000;
                auVar140._24_4_ = 0xbf800000;
                auVar140._28_4_ = 0xbf800000;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_4e0 = vfmadd132ps_avx512vl(local_3a0,auVar140,auVar32);
                local_3a0 = local_4e0;
                auVar113 = local_3a0;
                local_4a0 = (undefined4)lVar71;
                local_480 = local_6b0;
                uStack_478 = uStack_6a8;
                local_470 = local_6c0;
                uStack_468 = uStack_6b8;
                local_460 = local_640;
                uStack_458 = uStack_638;
                pGVar10 = (context->scene->geometries).items[uVar70].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar67 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar67 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar101 = vaddps_avx512vl(local_5e0,_DAT_02020f40);
                  auVar80 = vcvtsi2ss_avx512f(local_c0._0_16_,local_4a0);
                  fVar162 = auVar80._0_4_;
                  local_440[0] = (fVar162 + auVar101._0_4_) * (float)local_3e0._0_4_;
                  local_440[1] = (fVar162 + auVar101._4_4_) * (float)local_3e0._4_4_;
                  local_440[2] = (fVar162 + auVar101._8_4_) * fStack_3d8;
                  local_440[3] = (fVar162 + auVar101._12_4_) * fStack_3d4;
                  fStack_430 = (fVar162 + auVar101._16_4_) * fStack_3d0;
                  fStack_42c = (fVar162 + auVar101._20_4_) * fStack_3cc;
                  fStack_428 = (fVar162 + auVar101._24_4_) * fStack_3c8;
                  fStack_424 = fVar162 + auVar101._28_4_;
                  local_3a0._0_8_ = local_4e0._0_8_;
                  local_3a0._8_8_ = local_4e0._8_8_;
                  local_3a0._16_8_ = local_4e0._16_8_;
                  local_3a0._24_8_ = local_4e0._24_8_;
                  local_420 = local_3a0._0_8_;
                  uStack_418 = local_3a0._8_8_;
                  uStack_410 = local_3a0._16_8_;
                  uStack_408 = local_3a0._24_8_;
                  local_400 = local_600;
                  local_700._8_8_ = uStack_6a8;
                  local_700._0_8_ = local_6b0;
                  uVar65 = 0;
                  local_6d0 = (ulong)local_450;
                  for (uVar69 = local_6d0; (uVar69 & 1) == 0;
                      uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                    uVar65 = uVar65 + 1;
                  }
                  local_340 = local_6c0;
                  uStack_338 = uStack_6b8;
                  local_350 = local_640;
                  uStack_348 = uStack_638;
                  local_6f0 = CONCAT44(local_6f0._4_4_,1);
                  local_500 = local_5e0;
                  local_4c0 = local_600;
                  local_49c = iVar9;
                  local_490 = auVar82;
                  local_3a0 = auVar113;
                  do {
                    local_6e0 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar162 = local_440[uVar65];
                    auVar145._4_4_ = fVar162;
                    auVar145._0_4_ = fVar162;
                    auVar145._8_4_ = fVar162;
                    auVar145._12_4_ = fVar162;
                    local_280._16_4_ = fVar162;
                    local_280._0_16_ = auVar145;
                    local_280._20_4_ = fVar162;
                    local_280._24_4_ = fVar162;
                    local_280._28_4_ = fVar162;
                    local_260 = *(undefined4 *)((long)&local_420 + uVar65 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar65 * 4);
                    local_730.context = context->user;
                    fVar171 = 1.0 - fVar162;
                    auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar162 * (fVar171 + fVar171))),
                                               ZEXT416((uint)fVar171),ZEXT416((uint)fVar171));
                    auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,
                                              ZEXT416(0xc0a00000));
                    auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162 * 3.0)),
                                              ZEXT416((uint)(fVar162 + fVar162)),auVar80);
                    auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,
                                              ZEXT416(0x40000000));
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * -3.0)),
                                              ZEXT416((uint)(fVar171 + fVar171)),auVar80);
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),auVar145,
                                              ZEXT416((uint)(fVar171 * -2.0)));
                    fVar162 = auVar20._0_4_ * 0.5;
                    fVar171 = auVar75._0_4_ * 0.5;
                    fVar172 = auVar80._0_4_ * 0.5;
                    fVar173 = auVar81._0_4_ * 0.5;
                    auVar158._0_4_ = fVar173 * (float)local_350;
                    auVar158._4_4_ = fVar173 * local_350._4_4_;
                    auVar158._8_4_ = fVar173 * (float)uStack_348;
                    auVar158._12_4_ = fVar173 * uStack_348._4_4_;
                    auVar176._4_4_ = fVar172;
                    auVar176._0_4_ = fVar172;
                    auVar176._8_4_ = fVar172;
                    auVar176._12_4_ = fVar172;
                    auVar64._8_8_ = uStack_338;
                    auVar64._0_8_ = local_340;
                    auVar80 = vfmadd132ps_fma(auVar176,auVar158,auVar64);
                    auVar159._4_4_ = fVar171;
                    auVar159._0_4_ = fVar171;
                    auVar159._8_4_ = fVar171;
                    auVar159._12_4_ = fVar171;
                    auVar80 = vfmadd132ps_fma(auVar159,auVar80,local_700);
                    auVar137._4_4_ = fVar162;
                    auVar137._0_4_ = fVar162;
                    auVar137._8_4_ = fVar162;
                    auVar137._12_4_ = fVar162;
                    auVar80 = vfmadd213ps_fma(auVar137,auVar82,auVar80);
                    local_2e0 = auVar80._0_4_;
                    auVar170._8_4_ = 1;
                    auVar170._0_8_ = 0x100000001;
                    auVar170._12_4_ = 1;
                    auVar170._16_4_ = 1;
                    auVar170._20_4_ = 1;
                    auVar170._24_4_ = 1;
                    auVar170._28_4_ = 1;
                    local_2c0 = vpermps_avx2(auVar170,ZEXT1632(auVar80));
                    auVar180._8_4_ = 2;
                    auVar180._0_8_ = 0x200000002;
                    auVar180._12_4_ = 2;
                    auVar180._16_4_ = 2;
                    auVar180._20_4_ = 2;
                    auVar180._24_4_ = 2;
                    auVar180._28_4_ = 2;
                    local_2a0 = vpermps_avx2(auVar180,ZEXT1632(auVar80));
                    uStack_2dc = local_2e0;
                    uStack_2d8 = local_2e0;
                    uStack_2d4 = local_2e0;
                    uStack_2d0 = local_2e0;
                    uStack_2cc = local_2e0;
                    uStack_2c8 = local_2e0;
                    uStack_2c4 = local_2e0;
                    uStack_25c = local_260;
                    uStack_258 = local_260;
                    uStack_254 = local_260;
                    uStack_250 = local_260;
                    uStack_24c = local_260;
                    uStack_248 = local_260;
                    uStack_244 = local_260;
                    local_240 = local_560._0_8_;
                    uStack_238 = local_560._8_8_;
                    uStack_230 = local_560._16_8_;
                    uStack_228 = local_560._24_8_;
                    local_220 = local_520;
                    vpcmpeqd_avx2(local_520,local_520);
                    local_200 = (local_730.context)->instID[0];
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = (local_730.context)->instPrimID[0];
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_660 = local_320._0_8_;
                    uStack_658 = local_320._8_8_;
                    uStack_650 = local_320._16_8_;
                    uStack_648 = local_320._24_8_;
                    local_730.valid = (int *)&local_660;
                    local_730.geometryUserPtr = pGVar10->userPtr;
                    local_730.hit = (RTCHitN *)&local_2e0;
                    local_730.N = 8;
                    pRVar66 = (RayK<8> *)pGVar10->occlusionFilterN;
                    local_580._0_8_ = uVar65;
                    uVar69 = uVar65;
                    local_730.ray = (RTCRayN *)ray;
                    if (pRVar66 != (RayK<8> *)0x0) {
                      pRVar66 = (RayK<8> *)(*(code *)pRVar66)(&local_730);
                      uVar69 = local_580._0_8_;
                    }
                    auVar60._8_8_ = uStack_658;
                    auVar60._0_8_ = local_660;
                    auVar60._16_8_ = uStack_650;
                    auVar60._24_8_ = uStack_648;
                    if (auVar60 != (undefined1  [32])0x0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_730);
                        uVar69 = local_580._0_8_;
                      }
                      auVar80 = auVar203._0_16_;
                      auVar61._8_8_ = uStack_658;
                      auVar61._0_8_ = local_660;
                      auVar61._16_8_ = uStack_650;
                      auVar61._24_8_ = uStack_648;
                      uVar65 = vptestmd_avx512vl(auVar61,auVar61);
                      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar12 = (bool)((byte)uVar65 & 1);
                      auVar123._0_4_ =
                           (uint)bVar12 * auVar113._0_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x100);
                      bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
                      auVar123._4_4_ =
                           (uint)bVar12 * auVar113._4_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x104);
                      bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
                      auVar123._8_4_ =
                           (uint)bVar12 * auVar113._8_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x108);
                      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
                      auVar123._12_4_ =
                           (uint)bVar12 * auVar113._12_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x10c);
                      bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
                      auVar123._16_4_ =
                           (uint)bVar12 * auVar113._16_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x110);
                      bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
                      auVar123._20_4_ =
                           (uint)bVar12 * auVar113._20_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x114);
                      bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
                      auVar123._24_4_ =
                           (uint)bVar12 * auVar113._24_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x118);
                      bVar12 = SUB81(uVar65 >> 7,0);
                      auVar123._28_4_ =
                           (uint)bVar12 * auVar113._28_4_ |
                           (uint)!bVar12 * *(int *)(local_730.ray + 0x11c);
                      *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar123;
                      pRVar66 = (RayK<8> *)local_730.ray;
                      if (auVar61 != (undefined1  [32])0x0) break;
                    }
                    auVar80 = auVar203._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_6e0;
                    uVar65 = 0;
                    local_6d0 = local_6d0 ^ 1L << (uVar69 & 0x3f);
                    for (uVar69 = local_6d0; (uVar69 & 1) == 0;
                        uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                      uVar65 = uVar65 + 1;
                    }
                    local_6f0 = CONCAT44(local_6f0._4_4_,
                                         (int)CONCAT71((int7)((ulong)pRVar66 >> 8),local_6d0 != 0));
                  } while (local_6d0 != 0);
                  bVar67 = (byte)local_6f0 & 1;
                  auVar80 = vxorps_avx512vl(auVar80,auVar80);
                  auVar203 = ZEXT1664(auVar80);
                  in_ZMM20 = ZEXT3264(local_5e0);
                  auVar201 = ZEXT3264(local_600);
                  auVar202 = ZEXT3264(local_5a0);
                  auVar200 = ZEXT3264(local_680);
                  auVar199 = ZEXT3264(local_6a0);
                }
                bVar68 = (bool)(bVar68 | bVar67);
              }
            }
          }
          auVar183 = ZEXT3264(auVar148);
          auVar149 = ZEXT3264(auVar99);
          local_600 = auVar201._0_32_;
          lVar71 = lVar71 + 8;
        } while ((int)lVar71 < iVar9);
      }
      if (bVar68 != false) {
        return local_7b9;
      }
      uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar25._4_4_ = uVar133;
      auVar25._0_4_ = uVar133;
      auVar25._8_4_ = uVar133;
      auVar25._12_4_ = uVar133;
      uVar141 = vcmpps_avx512vl(local_330,auVar25,2);
      uVar70 = (uint)uVar72 & (uint)uVar141;
      uVar72 = (ulong)uVar70;
      local_7b9 = uVar70 != 0;
    } while (local_7b9);
  }
  return local_7b9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }